

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  Split *pSVar2;
  char *pcVar3;
  pointer *pppTVar4;
  float fVar5;
  undefined8 uVar6;
  int iVar7;
  undefined4 uVar8;
  BBox1f BVar9;
  MemoryMonitorInterface *pMVar10;
  Split *pSVar11;
  vint *pvVar12;
  code *pcVar13;
  ThreadLocal2 *pTVar14;
  NodeRefPtr<4> this_00;
  iterator iVar15;
  BBox1f *pBVar16;
  PrimRefMB *pPVar17;
  Scene *pSVar18;
  Geometry *pGVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  vuint<4> vVar33;
  vint *pvVar34;
  byte bVar35;
  char cVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *this_01;
  BBox1f BVar40;
  long lVar41;
  void *pvVar42;
  ulong uVar43;
  float *pfVar44;
  long lVar45;
  size_t sVar46;
  undefined8 *puVar47;
  runtime_error *prVar48;
  BBox1f *pBVar49;
  uint *puVar50;
  long lVar51;
  ulong *puVar52;
  byte bVar53;
  char *pcVar54;
  ulong uVar55;
  pointer *__ptr;
  BuildRecord *in_00;
  ulong uVar56;
  long lVar57;
  ulong uVar58;
  size_t i;
  PrimRefMB *pPVar59;
  uint uVar60;
  long *plVar61;
  ulong uVar62;
  ulong uVar63;
  mvector<PrimRefMB> *prims;
  ulong uVar64;
  bool bVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar91;
  float fVar92;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar93;
  float fVar94;
  float fVar97;
  float fVar98;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar99;
  undefined1 auVar100 [16];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar111;
  undefined1 auVar110 [16];
  float fVar112;
  float fVar115;
  float fVar116;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar117;
  undefined1 auVar118 [64];
  undefined1 auVar119 [16];
  float fVar120;
  undefined1 auVar121 [64];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1e58 [16];
  long local_1e40;
  undefined1 local_1e38 [16];
  undefined1 local_1e28 [16];
  undefined1 local_1e08 [16];
  undefined1 local_1df8 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1dc8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1db8 [2];
  PrimRefVector lprims;
  undefined1 local_1d88 [16];
  PrimInfoMB right;
  vuint<4> v2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1cd8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1cc8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aStack_1cb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ca8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1c98;
  BBox1f local_1c88;
  size_t sStack_1c80;
  size_t sStack_1c78;
  size_t sStack_1c70;
  float local_1c68;
  float fStack_1c64;
  float fStack_1c60;
  float fStack_1c5c;
  anon_class_1_0_00000001 reduction;
  vuint<4> v0;
  undefined1 local_1c28 [16];
  undefined1 auStack_1c18 [16];
  undefined1 local_1c08 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bf8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1be8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1bd8;
  BBox1f local_1bc8;
  size_t sStack_1bc0;
  size_t sStack_1bb8;
  size_t sStack_1bb0;
  undefined1 auStack_1ba8 [16];
  BBox1f local_1b98;
  undefined8 local_1b88;
  size_t sStack_1b80;
  size_t local_1b78;
  size_t local_1b68;
  size_t sStack_1b60;
  size_t sStack_1b58;
  size_t sStack_1b50;
  undefined1 (*local_1b48) [16];
  undefined8 uStack_1b40;
  vuint<4> v1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b28;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  size_t local_1ac8;
  size_t sStack_1ac0;
  size_t sStack_1ab8;
  size_t sStack_1ab0;
  undefined1 auStack_1aa8 [16];
  BBox1f local_1a98;
  undefined8 local_1a88;
  size_t sStack_1a80;
  size_t local_1a78;
  size_t local_1a68;
  size_t sStack_1a60;
  size_t sStack_1a58;
  size_t sStack_1a50;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_19e8 [16];
  anon_class_24_3_c5d13451 isLeft;
  vint vSplitPos;
  size_t local_18b8 [2];
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1898;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1888;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1878;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1868;
  ulong local_1858;
  ulong uStack_1850;
  size_t sStack_1848;
  undefined8 uStack_1840;
  undefined8 uStack_1838;
  BBox1f BStack_1830;
  BBox1f local_1828;
  longlong local_1818;
  undefined8 uStack_1810;
  size_t local_1808;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d4;
  vuint<4> geomID;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_17b8;
  undefined1 local_17a8 [16];
  undefined1 auStack_1798 [16];
  undefined1 local_1788 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1778;
  undefined1 local_1768 [16];
  ulong local_1758;
  ulong uStack_1750;
  size_t asStack_1748 [2];
  BBox1f local_1738;
  float fStack_1730;
  uint uStack_172c;
  BBox1f local_1728 [2];
  undefined1 local_1718 [16];
  size_t local_1708 [4];
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  BBox1f *local_8c8 [16];
  ulong local_848;
  BBox1f local_840;
  BBox1f local_838 [63];
  long local_640;
  NodeRecordMB4D values [16];
  
  uStack_1b40 = local_1b48;
  uVar43 = in->depth;
  if ((this->cfg).maxDepth < uVar43) {
    puVar47 = (undefined8 *)__cxa_allocate_exception(0x30);
    geomID.field_0.v[0] = (longlong)&local_17b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&geomID,"depth limit reached","");
    *puVar47 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar47 + 1) = 1;
    puVar47[2] = puVar47 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar47 + 2),geomID.field_0.v[0],geomID.field_0.v[1] + geomID.field_0.v[0]
              );
    __cxa_throw(puVar47,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  sVar46 = *(size_t *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.lower.field_0;
  uVar6 = *(undefined8 *)
           ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                   geomBounds.bounds0.lower.field_0 + 8);
  uVar26 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds0.upper.field_0;
  uVar27 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    geomBounds.bounds0.upper.field_0 + 8);
  aVar29 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.lower.field_0;
  aVar30 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0;
  aVar32 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           lower.field_0;
  aVar31 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
           upper.field_0;
  values[0].ref.ptr = (in->prims).super_PrimInfoMB.num_time_segments;
  values[0]._8_8_ = (in->prims).super_PrimInfoMB.max_num_time_segments;
  values[0].lbounds.bounds0.lower.field_0._0_8_ = (in->prims).super_PrimInfoMB.max_time_range;
  values[0].lbounds.bounds0.lower.field_0._8_8_ = (in->prims).super_PrimInfoMB.time_range;
  BVar9 = (BBox1f)(in->prims).prims;
  uVar63 = (in->prims).super_PrimInfoMB.object_range._begin;
  uVar55 = (in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)&geomID,this,&in->prims);
  sStack_1848 = values[0].ref.ptr;
  uStack_1840 = values[0]._8_8_;
  uStack_1838 = values[0].lbounds.bounds0.lower.field_0._0_8_;
  BStack_1830.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  BStack_1830.upper = (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
  BVar40 = BStack_1830;
  local_1718._0_8_ = geomID.field_0.v[0];
  local_1818 = geomID.field_0.v[0];
  uStack_1810 = geomID.field_0.v[1];
  local_1808 = local_17b8._0_8_;
  local_17f8 = local_17a8._0_8_;
  uStack_17f0 = local_17a8._8_8_;
  uStack_17e8 = auStack_1798._0_8_;
  uStack_17e0 = auStack_1798._8_8_;
  if ((uVar43 == 1) && (uVar55 != uVar63)) {
    BStack_1830.lower = (float)values[0].lbounds.bounds0.lower.field_0._8_8_;
    BStack_1830.upper = (float)((ulong)values[0].lbounds.bounds0.lower.field_0._8_8_ >> 0x20);
    lVar38 = uVar55 - uVar63;
    if (uVar55 < uVar63 || lVar38 == 0) {
      auVar68 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar49 = &(*(PrimRefMB **)((long)BVar9 + 0x20))[uVar63].time_range;
      auVar68 = ZEXT816(0xff8000007f800000);
      do {
        auVar83._8_8_ = 0;
        auVar83._0_4_ = pBVar49->lower;
        auVar83._4_4_ = pBVar49->upper;
        auVar70 = vcmpps_avx(auVar68,auVar83,1);
        auVar69 = vinsertps_avx(auVar68,auVar83,0x50);
        auVar68 = vblendps_avx(auVar83,auVar68,2);
        auVar68 = vblendvps_avx(auVar68,auVar69,auVar70);
        pBVar49 = pBVar49 + 10;
        lVar38 = lVar38 + -1;
      } while (lVar38 != 0);
    }
    auVar70 = vmovshdup_avx(auVar68);
    auVar70 = vcmpps_avx(auVar70,ZEXT416((uint)BStack_1830.upper),1);
    auVar68 = vcmpps_avx(ZEXT416((uint)BStack_1830.lower),auVar68,1);
    auVar68 = vorps_avx(auVar68,auVar70);
    bVar53 = auVar68[0] & 1;
  }
  else {
    bVar53 = 0;
  }
  local_18b8[0] = sVar46;
  local_18b8[1] = uVar6;
  local_18a8 = uVar26;
  uStack_18a0 = uVar27;
  local_1898 = aVar29;
  local_1888 = aVar30;
  local_1878 = aVar32;
  local_1868 = aVar31;
  local_1858 = uVar63;
  uStack_1850 = uVar55;
  BStack_1830 = BVar40;
  local_1828 = BVar9;
  if (((uVar55 - uVar63 <= (this->cfg).maxLeafSize) &&
      (uStack_1810._4_4_ = geomID.field_0._12_4_, uStack_1810._4_4_ < 2)) && (bVar53 == 0)) {
    uVar55 = (uVar55 - uVar63) + 3;
    uVar43 = uVar55 >> 2;
    v1.field_0.v[0] = uVar43 * 0x60;
    this_00.ptr = (size_t)(alloc.talloc1)->parent;
    if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = this_00.ptr;
      MutexSys::lock((MutexSys *)this_00.ptr);
      if ((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p != (__pointer_type)0x0
         ) {
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xa8) + (long)*(void **)(this_00.ptr + 0x68);
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((long)*(void **)(this_00.ptr + 0x58) + (long)*(void **)(this_00.ptr + 0x98)) -
             ((long)*(void **)(this_00.ptr + 0x50) + (long)*(void **)(this_00.ptr + 0x90)));
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesWasted
        ;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xb0) + (long)*(void **)(this_00.ptr + 0x70);
        UNLOCK();
      }
      auVar68 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(this_00.ptr + 0x58) = ZEXT1632(auVar68);
      *(undefined1 (*) [32])(this_00.ptr + 0x48) = ZEXT1632(auVar68);
      auVar74 = ZEXT1632(auVar68);
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar74;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar74;
      }
      else {
        *(void **)(this_00.ptr + 0x60) = (void *)(alloc.alloc)->defaultBlockSize;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar74;
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar74;
        *(void **)(this_00.ptr + 0xa0) = (void *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p = alloc.alloc;
      UNLOCK();
      v0.field_0.v[0] = this_00.ptr;
      geomID.field_0.v[1]._0_1_ = 1;
      geomID.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar15._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar15,(ThreadLocal2 **)&v0);
      }
      else {
        *iVar15._M_current = (ThreadLocal2 *)v0.field_0.v[0];
        pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar4 = *pppTVar4 + 1;
      }
      if (geomID.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)geomID.field_0.v[0]);
      }
      if (values[0]._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)values[0].ref.ptr);
      }
    }
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + v1.field_0.v[0];
    sVar46 = (alloc.talloc1)->cur;
    uVar58 = (ulong)(-(int)sVar46 & 0x1f);
    uVar56 = sVar46 + v1.field_0.v[0] + uVar58;
    (alloc.talloc1)->cur = uVar56;
    if ((alloc.talloc1)->end < uVar56) {
      (alloc.talloc1)->cur = sVar46;
      if ((alloc.talloc1)->allocBlockSize < (ulong)(v1.field_0.v[0] << 2)) {
        pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v1);
      }
      else {
        geomID.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
        pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
        (alloc.talloc1)->ptr = pcVar54;
        sVar46 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar46;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = geomID.field_0.v[0];
        (alloc.talloc1)->cur = v1.field_0.v[0];
        if ((ulong)geomID.field_0.v[0] < (ulong)v1.field_0.v[0]) {
          (alloc.talloc1)->cur = 0;
          geomID.field_0.v[0] = (alloc.talloc1)->allocBlockSize;
          pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&geomID);
          (alloc.talloc1)->ptr = pcVar54;
          sVar46 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar46;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = geomID.field_0.v[0];
          (alloc.talloc1)->cur = v1.field_0.v[0];
          if ((ulong)geomID.field_0.v[0] < (ulong)v1.field_0.v[0]) {
            (alloc.talloc1)->cur = 0;
            pcVar54 = (char *)0x0;
            goto LAB_014140d1;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar46;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar58;
      pcVar54 = (alloc.talloc1)->ptr + (uVar56 - v1.field_0._0_8_);
    }
LAB_014140d1:
    uVar56 = 7;
    if (uVar43 < 7) {
      uVar56 = uVar43;
    }
    if (uVar55 < 4) {
      auVar72._8_4_ = 0x7f800000;
      auVar72._0_8_ = 0x7f8000007f800000;
      auVar72._12_4_ = 0x7f800000;
      local_1e08._8_4_ = 0xff800000;
      local_1e08._0_8_ = 0xff800000ff800000;
      local_1e08._12_4_ = 0xff800000;
      local_1e28._8_4_ = 0xff800000;
      local_1e28._0_8_ = 0xff800000ff800000;
      local_1e28._12_4_ = 0xff800000;
      local_1d88 = auVar72;
    }
    else {
      auVar72._8_4_ = 0x7f800000;
      auVar72._0_8_ = 0x7f8000007f800000;
      auVar72._12_4_ = 0x7f800000;
      local_1e40 = 0;
      auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar118 = ZEXT1664(ZEXT816(0) << 0x40);
      local_1e28._8_4_ = 0xff800000;
      local_1e28._0_8_ = 0xff800000ff800000;
      local_1e28._12_4_ = 0xff800000;
      local_1e08._8_4_ = 0xff800000;
      local_1e08._0_8_ = 0xff800000ff800000;
      local_1e08._12_4_ = 0xff800000;
      local_1d88 = auVar72;
      do {
        pPVar17 = *(PrimRefMB **)((long)local_1828 + 0x20);
        pSVar18 = ((this->createLeaf).bvh)->scene;
        auVar80._8_8_ = 0;
        auVar80._0_4_ = BStack_1830.lower;
        auVar80._4_4_ = BStack_1830.upper;
        auVar81._8_8_ = 0;
        auVar81._0_4_ = BStack_1830.lower;
        auVar81._4_4_ = BStack_1830.upper;
        geomID.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar80,auVar81)
        ;
        pPVar59 = pPVar17 + uVar63;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
             auVar121._0_16_;
        lVar38 = 0;
        v2.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
                     right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0;
        v0.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
                     right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0;
        v1.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
                     right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0;
        values[0]._0_16_ = (undefined1  [16])geomID.field_0;
        do {
          if (uVar63 < uStack_1850) {
            fVar5 = (pPVar59->lbounds).bounds0.lower.field_0.m128[3];
            *(float *)((long)&geomID.field_0 + lVar38) = fVar5;
            fVar24 = (pPVar59->lbounds).bounds0.upper.field_0.m128[3];
            *(float *)((long)&values[0].ref.ptr + lVar38) = fVar24;
            pGVar19 = (pSVar18->geometries).items[(uint)fVar5].ptr;
            lVar39 = (ulong)(uint)fVar24 *
                     pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
            lVar41 = *(long *)&pGVar19->field_0x58;
            uVar37 = *(uint *)&pGVar19[1].intersectionFilterN >> 2;
            *(uint *)((long)&v0.field_0 + lVar38) = *(int *)(lVar41 + lVar39) * uVar37;
            *(uint *)((long)&v1.field_0 + lVar38) = *(int *)(lVar41 + 4 + lVar39) * uVar37;
            *(uint *)((long)&v2.field_0 + lVar38) = *(int *)(lVar41 + 8 + lVar39) * uVar37;
            *(uint *)((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
                             .lower.field_0 + lVar38) = uVar37 * *(int *)(lVar41 + 0xc + lVar39);
            uVar63 = uVar63 + 1;
          }
          else if (lVar38 != 0) {
            *(uint *)((long)&geomID.field_0 + lVar38) = geomID.field_0.i[0];
            *(undefined4 *)((long)&values[0].ref.ptr + lVar38) = 0xffffffff;
            uVar8 = v0.field_0.i[0];
            *(uint *)((long)&v0.field_0 + lVar38) = v0.field_0.i[0];
            *(undefined4 *)((long)&v1.field_0 + lVar38) = uVar8;
            *(undefined4 *)((long)&v2.field_0 + lVar38) = uVar8;
            *(undefined4 *)
             ((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0 + lVar38) = uVar8;
          }
          if (uVar63 < uStack_1850) {
            pPVar59 = pPVar17 + uVar63;
          }
          lVar38 = lVar38 + 4;
        } while (lVar38 != 0x10);
        lVar38 = local_1e40 * 0x60;
        *(longlong *)(pcVar54 + lVar38) = v0.field_0.v[0];
        *(longlong *)((long)(pcVar54 + lVar38) + 8) = v0.field_0.v[1];
        *(longlong *)(pcVar54 + lVar38 + 0x10) = v1.field_0.v[0];
        *(longlong *)((long)(pcVar54 + lVar38 + 0x10) + 8) = v1.field_0.v[1];
        *(longlong *)(pcVar54 + lVar38 + 0x20) = v2.field_0.v[0];
        *(longlong *)((long)(pcVar54 + lVar38 + 0x20) + 8) = v2.field_0.v[1];
        *(undefined8 *)(pcVar54 + lVar38 + 0x30) =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        *(undefined8 *)(pcVar54 + lVar38 + 0x30 + 8) =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        *(longlong *)(pcVar54 + lVar38 + 0x40) = geomID.field_0.v[0];
        *(longlong *)((long)(pcVar54 + lVar38 + 0x40) + 8) = geomID.field_0.v[1];
        *(size_t *)(pcVar54 + lVar38 + 0x50) = values[0].ref.ptr;
        *(undefined8 *)((long)(pcVar54 + lVar38 + 0x50) + 8) = values[0]._8_8_;
        auVar69 = vmovshdup_avx(auVar80);
        lVar41 = 0;
        auVar82._8_4_ = 0xff800000;
        auVar82._0_8_ = 0xff800000ff800000;
        auVar82._12_4_ = 0xff800000;
        auVar73._8_4_ = 0x7f800000;
        auVar73._0_8_ = 0x7f8000007f800000;
        auVar73._12_4_ = 0x7f800000;
        auVar68 = auVar82;
        auVar70 = auVar73;
        do {
          if ((ulong)*(uint *)(pcVar54 + lVar41 * 4 + lVar38 + 0x50) == 0xffffffff) break;
          pGVar19 = (pSVar18->geometries).items[*(uint *)(pcVar54 + lVar41 * 4 + lVar38 + 0x40)].ptr
          ;
          fVar5 = pGVar19->fnumTimeSegments;
          fVar24 = (pGVar19->time_range).lower;
          local_1db8[0].i[0] = BStack_1830.lower;
          fVar66 = (pGVar19->time_range).upper - fVar24;
          fVar87 = ((float)local_1db8[0]._0_4_ - fVar24) / fVar66;
          local_1b48._0_4_ = auVar69._0_4_;
          fVar66 = (local_1b48._0_4_ - fVar24) / fVar66;
          fVar24 = fVar5 * fVar87;
          fVar101 = fVar5 * fVar66;
          auVar85 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),9);
          auVar25 = vroundss_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),10);
          auVar71 = auVar118._0_16_;
          auVar83 = vmaxss_avx(auVar85,auVar71);
          auVar77 = vminss_avx(auVar25,ZEXT416((uint)fVar5));
          iVar7 = (int)auVar85._0_4_;
          if ((int)auVar85._0_4_ < 0) {
            iVar7 = -1;
          }
          uVar37 = (int)fVar5 + 1U;
          if ((int)auVar25._0_4_ < (int)((int)fVar5 + 1U)) {
            uVar37 = (int)auVar25._0_4_;
          }
          lVar39 = *(long *)&pGVar19->field_0x58;
          lVar51 = (ulong)*(uint *)(pcVar54 + lVar41 * 4 + lVar38 + 0x50) *
                   pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          uVar64 = (ulong)*(uint *)(lVar39 + lVar51);
          uVar62 = (ulong)*(uint *)(lVar39 + 4 + lVar51);
          lVar20 = *(long *)&pGVar19[2].numPrimitives;
          lVar57 = (long)(int)auVar83._0_4_ * 0x38;
          lVar21 = *(long *)(lVar20 + lVar57);
          lVar45 = *(long *)(lVar20 + 0x10 + lVar57);
          auVar85 = *(undefined1 (*) [16])(lVar21 + lVar45 * uVar64);
          auVar25 = *(undefined1 (*) [16])(lVar21 + lVar45 * uVar62);
          uVar58 = (ulong)*(uint *)(lVar39 + 8 + lVar51);
          auVar78 = *(undefined1 (*) [16])(lVar21 + lVar45 * uVar58);
          fVar94 = auVar77._0_4_;
          uVar55 = (ulong)*(uint *)(lVar39 + 0xc + lVar51);
          auVar77 = *(undefined1 (*) [16])(lVar21 + lVar45 * uVar55);
          auVar79 = vminps_avx(auVar85,auVar25);
          auVar67 = vminps_avx(auVar78,auVar77);
          auVar76 = vminps_avx(auVar79,auVar67);
          lVar45 = (long)(int)fVar94 * 0x38;
          lVar39 = *(long *)(lVar20 + lVar45);
          lVar21 = *(long *)(lVar20 + 0x10 + lVar45);
          auVar79 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar64);
          auVar67 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar62);
          auVar75 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar58);
          auVar25 = vmaxps_avx(auVar85,auVar25);
          auVar85 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar55);
          auVar77 = vmaxps_avx(auVar78,auVar77);
          auVar77 = vmaxps_avx(auVar25,auVar77);
          auVar25 = vminps_avx(auVar79,auVar67);
          auVar78 = vminps_avx(auVar75,auVar85);
          auVar78 = vminps_avx(auVar25,auVar78);
          auVar25 = vmaxps_avx(auVar79,auVar67);
          auVar85 = vmaxps_avx(auVar75,auVar85);
          auVar85 = vmaxps_avx(auVar25,auVar85);
          auVar83 = ZEXT416((uint)(fVar24 - auVar83._0_4_));
          fVar120 = auVar78._0_4_;
          fVar112 = auVar76._0_4_;
          fVar97 = auVar77._0_4_;
          fVar98 = auVar77._4_4_;
          fVar99 = auVar77._8_4_;
          fVar111 = auVar77._12_4_;
          fVar24 = auVar78._4_4_;
          fVar22 = auVar78._8_4_;
          fVar23 = auVar78._12_4_;
          fVar106 = auVar85._0_4_;
          fVar91 = auVar85._4_4_;
          fVar92 = auVar85._8_4_;
          fVar93 = auVar85._12_4_;
          fVar115 = auVar76._4_4_;
          fVar116 = auVar76._8_4_;
          fVar117 = auVar76._12_4_;
          if (uVar37 - iVar7 == 1) {
            auVar83 = vmaxss_avx(auVar83,auVar71);
            auVar77 = vshufps_avx(auVar83,auVar83,0);
            auVar83 = ZEXT416((uint)(1.0 - auVar83._0_4_));
            auVar83 = vshufps_avx(auVar83,auVar83,0);
            auVar84._0_4_ = fVar112 * auVar83._0_4_ + fVar120 * auVar77._0_4_;
            auVar84._4_4_ = fVar115 * auVar83._4_4_ + fVar24 * auVar77._4_4_;
            auVar84._8_4_ = fVar116 * auVar83._8_4_ + fVar22 * auVar77._8_4_;
            auVar84._12_4_ = fVar117 * auVar83._12_4_ + fVar23 * auVar77._12_4_;
            auVar100._0_4_ = fVar97 * auVar83._0_4_ + fVar106 * auVar77._0_4_;
            auVar100._4_4_ = fVar98 * auVar83._4_4_ + fVar91 * auVar77._4_4_;
            auVar100._8_4_ = fVar99 * auVar83._8_4_ + fVar92 * auVar77._8_4_;
            auVar100._12_4_ = fVar111 * auVar83._12_4_ + fVar93 * auVar77._12_4_;
            auVar83 = vmaxss_avx(ZEXT416((uint)(fVar94 - fVar101)),auVar71);
            auVar77 = vshufps_avx(auVar83,auVar83,0);
            auVar83 = ZEXT416((uint)(1.0 - auVar83._0_4_));
            auVar83 = vshufps_avx(auVar83,auVar83,0);
            auVar90._0_4_ = fVar112 * auVar77._0_4_ + fVar120 * auVar83._0_4_;
            auVar90._4_4_ = fVar115 * auVar77._4_4_ + fVar24 * auVar83._4_4_;
            auVar90._8_4_ = fVar116 * auVar77._8_4_ + fVar22 * auVar83._8_4_;
            auVar90._12_4_ = fVar117 * auVar77._12_4_ + fVar23 * auVar83._12_4_;
            auVar96._0_4_ = fVar97 * auVar77._0_4_ + fVar106 * auVar83._0_4_;
            auVar96._4_4_ = fVar98 * auVar77._4_4_ + fVar91 * auVar83._4_4_;
            auVar96._8_4_ = fVar99 * auVar77._8_4_ + fVar92 * auVar83._8_4_;
            auVar96._12_4_ = fVar111 * auVar77._12_4_ + fVar93 * auVar83._12_4_;
LAB_014147b6:
            auVar83 = ZEXT816(0) << 0x20;
          }
          else {
            lVar39 = *(long *)(lVar20 + 0x38 + lVar57);
            lVar21 = *(long *)(lVar20 + 0x48 + lVar57);
            auVar77 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar64);
            auVar85 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar62);
            auVar25 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar58);
            auVar71 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar55);
            auVar78 = vminps_avx(auVar77,auVar85);
            auVar79 = vminps_avx(auVar25,auVar71);
            auVar79 = vminps_avx(auVar78,auVar79);
            auVar77 = vmaxps_avx(auVar77,auVar85);
            auVar85 = vmaxps_avx(auVar25,auVar71);
            auVar78 = vmaxps_avx(auVar77,auVar85);
            lVar39 = *(long *)(lVar20 + -0x38 + lVar45);
            lVar21 = *(long *)(lVar20 + -0x28 + lVar45);
            auVar77 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar64);
            auVar85 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar62);
            auVar25 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar58);
            auVar71 = *(undefined1 (*) [16])(lVar39 + lVar21 * uVar55);
            auVar67 = vminps_avx(auVar77,auVar85);
            auVar75 = vminps_avx(auVar25,auVar71);
            auVar67 = vminps_avx(auVar67,auVar75);
            auVar77 = vmaxps_avx(auVar77,auVar85);
            auVar85 = vmaxps_avx(auVar25,auVar71);
            auVar77 = vmaxps_avx(auVar77,auVar85);
            auVar83 = vmaxss_avx(auVar83,ZEXT816(0) << 0x20);
            auVar85 = vshufps_avx(auVar83,auVar83,0);
            auVar83 = ZEXT416((uint)(1.0 - auVar83._0_4_));
            auVar83 = vshufps_avx(auVar83,auVar83,0);
            auVar84._0_4_ = fVar112 * auVar83._0_4_ + auVar79._0_4_ * auVar85._0_4_;
            auVar84._4_4_ = fVar115 * auVar83._4_4_ + auVar79._4_4_ * auVar85._4_4_;
            auVar84._8_4_ = fVar116 * auVar83._8_4_ + auVar79._8_4_ * auVar85._8_4_;
            auVar84._12_4_ = fVar117 * auVar83._12_4_ + auVar79._12_4_ * auVar85._12_4_;
            auVar100._0_4_ = fVar97 * auVar83._0_4_ + auVar85._0_4_ * auVar78._0_4_;
            auVar100._4_4_ = fVar98 * auVar83._4_4_ + auVar85._4_4_ * auVar78._4_4_;
            auVar100._8_4_ = fVar99 * auVar83._8_4_ + auVar85._8_4_ * auVar78._8_4_;
            auVar100._12_4_ = fVar111 * auVar83._12_4_ + auVar85._12_4_ * auVar78._12_4_;
            auVar83 = vmaxss_avx(ZEXT416((uint)(fVar94 - fVar101)),ZEXT816(0) << 0x20);
            auVar85 = vshufps_avx(auVar83,auVar83,0);
            auVar83 = ZEXT416((uint)(1.0 - auVar83._0_4_));
            auVar83 = vshufps_avx(auVar83,auVar83,0);
            auVar90._0_4_ = auVar83._0_4_ * fVar120 + auVar67._0_4_ * auVar85._0_4_;
            auVar90._4_4_ = auVar83._4_4_ * fVar24 + auVar67._4_4_ * auVar85._4_4_;
            auVar90._8_4_ = auVar83._8_4_ * fVar22 + auVar67._8_4_ * auVar85._8_4_;
            auVar90._12_4_ = auVar83._12_4_ * fVar23 + auVar67._12_4_ * auVar85._12_4_;
            auVar96._0_4_ = auVar83._0_4_ * fVar106 + auVar85._0_4_ * auVar77._0_4_;
            auVar96._4_4_ = auVar83._4_4_ * fVar91 + auVar85._4_4_ * auVar77._4_4_;
            auVar96._8_4_ = auVar83._8_4_ * fVar92 + auVar85._8_4_ * auVar77._8_4_;
            auVar96._12_4_ = auVar83._12_4_ * fVar93 + auVar85._12_4_ * auVar77._12_4_;
            uVar60 = iVar7 + 1;
            if ((int)uVar37 <= (int)uVar60) goto LAB_014147b6;
            plVar61 = (long *)(lVar20 + (ulong)uVar60 * 0x38 + 0x10);
            auVar83 = ZEXT816(0) << 0x20;
            do {
              auVar104._0_4_ = ((float)(int)uVar60 / fVar5 - fVar87) / (fVar66 - fVar87);
              auVar104._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar77 = vshufps_avx(auVar104,auVar104,0);
              fVar91 = auVar90._4_4_;
              fVar92 = auVar90._8_4_;
              fVar93 = auVar90._12_4_;
              auVar85 = vshufps_avx(ZEXT416((uint)(1.0 - auVar104._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar104._0_4_)),0);
              fVar24 = auVar84._4_4_;
              fVar22 = auVar84._8_4_;
              fVar94 = auVar84._12_4_;
              auVar110._0_4_ = auVar90._0_4_ * auVar77._0_4_ + auVar85._0_4_ * auVar84._0_4_;
              auVar110._4_4_ = fVar91 * auVar77._4_4_ + auVar85._4_4_ * fVar24;
              auVar110._8_4_ = fVar92 * auVar77._8_4_ + auVar85._8_4_ * fVar22;
              auVar110._12_4_ = fVar93 * auVar77._12_4_ + auVar85._12_4_ * fVar94;
              fVar97 = auVar96._4_4_;
              fVar98 = auVar96._8_4_;
              fVar99 = auVar96._12_4_;
              fVar101 = auVar100._4_4_;
              fVar23 = auVar100._8_4_;
              fVar106 = auVar100._12_4_;
              auVar105._0_4_ = auVar85._0_4_ * auVar100._0_4_ + auVar96._0_4_ * auVar77._0_4_;
              auVar105._4_4_ = auVar85._4_4_ * fVar101 + fVar97 * auVar77._4_4_;
              auVar105._8_4_ = auVar85._8_4_ * fVar23 + fVar98 * auVar77._8_4_;
              auVar105._12_4_ = auVar85._12_4_ * fVar106 + fVar99 * auVar77._12_4_;
              lVar39 = plVar61[-2];
              lVar20 = *plVar61;
              auVar77 = *(undefined1 (*) [16])(lVar39 + lVar20 * uVar64);
              auVar85 = *(undefined1 (*) [16])(lVar39 + lVar20 * uVar62);
              auVar25 = *(undefined1 (*) [16])(lVar39 + lVar20 * uVar58);
              auVar71 = *(undefined1 (*) [16])(lVar39 + lVar20 * uVar55);
              auVar78 = vminps_avx(auVar77,auVar85);
              auVar79 = vminps_avx(auVar25,auVar71);
              auVar78 = vminps_avx(auVar78,auVar79);
              auVar78 = vsubps_avx(auVar78,auVar110);
              auVar77 = vmaxps_avx(auVar77,auVar85);
              auVar85 = vmaxps_avx(auVar25,auVar71);
              auVar77 = vmaxps_avx(auVar77,auVar85);
              auVar85 = vsubps_avx(auVar77,auVar105);
              auVar77 = vminps_avx(auVar78,auVar83);
              auVar84._0_4_ = auVar77._0_4_ + auVar84._0_4_;
              auVar84._4_4_ = auVar77._4_4_ + fVar24;
              auVar84._8_4_ = auVar77._8_4_ + fVar22;
              auVar84._12_4_ = auVar77._12_4_ + fVar94;
              auVar90._0_4_ = auVar77._0_4_ + auVar90._0_4_;
              auVar90._4_4_ = auVar77._4_4_ + fVar91;
              auVar90._8_4_ = auVar77._8_4_ + fVar92;
              auVar90._12_4_ = auVar77._12_4_ + fVar93;
              auVar77 = vmaxps_avx(auVar85,auVar83);
              auVar100._0_4_ = auVar100._0_4_ + auVar77._0_4_;
              auVar100._4_4_ = fVar101 + auVar77._4_4_;
              auVar100._8_4_ = fVar23 + auVar77._8_4_;
              auVar100._12_4_ = fVar106 + auVar77._12_4_;
              auVar96._0_4_ = auVar96._0_4_ + auVar77._0_4_;
              auVar96._4_4_ = fVar97 + auVar77._4_4_;
              auVar96._8_4_ = fVar98 + auVar77._8_4_;
              auVar96._12_4_ = fVar99 + auVar77._12_4_;
              uVar60 = uVar60 + 1;
              plVar61 = plVar61 + 7;
            } while (uVar37 != uVar60);
          }
          auVar121 = ZEXT1664(auVar83);
          auVar70 = vminps_avx(auVar70,auVar84);
          auVar82 = vmaxps_avx(auVar82,auVar100);
          auVar73 = vminps_avx(auVar73,auVar90);
          auVar68 = vmaxps_avx(auVar68,auVar96);
          lVar41 = lVar41 + 1;
          auVar118 = ZEXT1664(ZEXT816(0) << 0x40);
        } while (lVar41 != 4);
        local_1e28 = vmaxps_avx(local_1e28,auVar68);
        local_1d88 = vminps_avx(local_1d88,auVar73);
        local_1e08 = vmaxps_avx(local_1e08,auVar82);
        auVar72 = vminps_avx(auVar72,auVar70);
        local_1e40 = local_1e40 + 1;
      } while (local_1e40 != uVar43 + (uVar43 == 0));
    }
    (__return_storage_ptr__->ref).ptr = uVar56 | (ulong)pcVar54 | 8;
    *(undefined1 (*) [16])(__return_storage_ptr__->lbounds).bounds0.lower.field_0.m128 = auVar72;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e08._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e08._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d88._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1d88._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1e28._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         local_1e28._8_8_;
    __return_storage_ptr__->dt = BStack_1830;
    return __return_storage_ptr__;
  }
  lVar38 = 0xbc;
  do {
    *(undefined8 *)((long)&uStack_17d4 + lVar38) = 0xffffffff7f800000;
    *(undefined8 *)(&stack0xffffffffffffe834 + lVar38) = 0;
    lVar38 = lVar38 + 0xf0;
  } while (lVar38 != 0xfbc);
  local_848 = 1;
  local_640 = 1;
  geomID.field_0.v[0] = uVar43;
  local_1758 = uVar63;
  uStack_1750 = uVar55;
  asStack_1748[0] = values[0].ref.ptr;
  asStack_1748[1] = values[0]._8_8_;
  local_1738.lower = (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
  local_1738.upper = (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
  fStack_1730 = (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
  uStack_172c = values[0].lbounds.bounds0.lower.field_0._12_4_;
  local_1728[0] = BVar9;
  local_1718._8_8_ = geomID.field_0.v[1];
  local_1708[0] = local_17b8._0_8_;
  local_1708[2] = local_17a8._0_8_;
  local_1708[3] = local_17a8._8_8_;
  local_16e8 = auStack_1798._0_8_;
  uStack_16e0 = auStack_1798._8_8_;
  local_840 = BVar9;
  local_838[0].lower = 2.8026e-45;
  local_838[0].upper = 0.0;
  local_8c8[0] = &local_840;
  local_1b48 = (undefined1 (*) [16])&sStack_1ab8;
  local_1df8._8_4_ = 0x7f800000;
  local_1df8._0_8_ = 0x7f8000007f800000;
  local_1df8._12_4_ = 0x7f800000;
  local_1dc8._8_4_ = 0xff800000;
  local_1dc8._0_8_ = 0xff800000ff800000;
  local_1dc8._12_4_ = 0xff800000;
  bVar35 = 0;
  local_17b8._0_8_ = sVar46;
  local_17b8._8_8_ = uVar6;
  local_17a8._0_8_ = uVar26;
  local_17a8._8_8_ = uVar27;
  auStack_1798 = (undefined1  [16])aVar29;
  local_1788 = (undefined1  [16])aVar30;
  local_1778 = aVar32;
  local_1768 = (undefined1  [16])aVar31;
  do {
    if (local_848 == 0) {
      uVar63 = 0xffffffffffffffff;
    }
    else {
      uVar63 = 0xffffffffffffffff;
      puVar52 = &local_1758;
      uVar55 = 0;
      uVar56 = 0;
      do {
        uVar58 = puVar52[1] - *puVar52;
        if ((((this->cfg).maxLeafSize < uVar58) || (1 < *(uint *)((long)(puVar52 + 9) + 4))) ||
           (bVar53 != 0)) {
          if (uVar55 < uVar58) {
            uVar63 = uVar56;
            uVar55 = uVar58;
          }
          bVar53 = 0;
        }
        uVar56 = uVar56 + 1;
        puVar52 = puVar52 + 0x1e;
      } while (local_848 != uVar56);
    }
    if (uVar63 != 0xffffffffffffffff) {
      lVar38 = uVar63 * 0xf0;
      v0.field_0.v[0] = uVar43 + 1;
      local_1b88 = 0xffffffff7f800000;
      sStack_1b80 = 0;
      v1.field_0.v[0] = uVar43 + 1;
      local_1a88 = 0xffffffff7f800000;
      sStack_1a80 = 0;
      pSVar2 = (Split *)(local_1718 + uVar63 * 0xf0);
      iVar7 = *(int *)((long)local_1708 + lVar38 + -4);
      if (iVar7 == 0) {
        BVar9 = *(BBox1f *)(local_1768 + (uVar63 * 0x1e + 1) * 8 + 8);
        sVar46 = *(size_t *)(local_1768 + (uVar63 * 0x1e + 2) * 8 + 8);
        v2.field_0.i[2] = 0x7f800000;
        v2.field_0.v[0] = 0x7f8000007f800000;
        v2.field_0.i[3] = 0x7f800000;
        aStack_1cd8.m128[0] = -INFINITY;
        aStack_1cd8.m128[1] = -INFINITY;
        aStack_1cd8.m128[2] = -INFINITY;
        aStack_1cd8.m128[3] = -INFINITY;
        local_1cc8.i[0] = 0x7f800000;
        local_1cc8.i[1] = 0x7f800000;
        local_1cc8.i[2] = 0x7f800000;
        local_1cc8.i[3] = 0x7f800000;
        aStack_1cb8.i[0] = -0x800000;
        aStack_1cb8.i[1] = -0x800000;
        aStack_1cb8.i[2] = -0x800000;
        aStack_1cb8.i[3] = -0x800000;
        local_1ca8.m128[0] = INFINITY;
        local_1ca8.m128[1] = INFINITY;
        local_1ca8.m128[2] = INFINITY;
        local_1ca8.m128[3] = INFINITY;
        aStack_1c98.m128[0] = -INFINITY;
        aStack_1c98.m128[1] = -INFINITY;
        aStack_1c98.m128[2] = -INFINITY;
        aStack_1c98.m128[3] = -INFINITY;
        local_1c68 = 0.0;
        local_1c88.lower = 0.0;
        local_1c88.upper = 0.0;
        sStack_1c80 = 0;
        sStack_1c78 = 0;
        sStack_1c70 = 0;
        auVar88._8_4_ = 0x3f800000;
        auVar88._0_8_ = &DAT_3f8000003f800000;
        auVar88._12_4_ = 0x3f800000;
        lVar41 = vmovlps_avx(auVar88);
        fStack_1c64 = (float)lVar41;
        fStack_1c60 = (float)((ulong)lVar41 >> 0x20);
        fStack_1c5c = 0.0;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        uVar6 = vmovlps_avx(auVar88);
        right.max_time_range.upper = (float)uVar6;
        right.time_range.lower = (float)((ulong)uVar6 >> 0x20);
        right.time_range.upper = 0.0;
        vSplitPos.field_0.i[1] = (int)local_1708[uVar63 * 0x1e + -1];
        vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
        vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
        lVar39 = (long)(1 << (local_1718[lVar38 + 4] & 0x1f)) * 0x10;
        vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar39);
        vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar39 + 8);
        isLeft.vSplitPos = &vSplitPos;
        isLeft.vSplitMask = &vSplitMask;
        isLeft.split = pSVar2;
        sStack_1bc0 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                (*(PrimRefMB **)((long)local_1728[uVar63 * 0x1e] + 0x20),
                                 (size_t)BVar9,sVar46,(EmptyTy *)local_19e8,
                                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,&right,&isLeft,
                                 &reduction,&reduction2,0x80,0xc00);
        auVar68 = auStack_1ba8;
        local_1b98 = local_1728[uVar63 * 0x1e];
        auVar67._8_8_ = 0;
        auVar67._0_4_ = local_1728[uVar63 * 0x1e + -1].lower;
        auVar67._4_4_ = local_1728[uVar63 * 0x1e + -1].upper;
        auStack_1c18._0_4_ = -INFINITY;
        auStack_1c18._4_4_ = -INFINITY;
        auStack_1c18._8_4_ = -INFINITY;
        auStack_1c18._12_4_ = -INFINITY;
        local_1c08._0_4_ = INFINITY;
        local_1c08._4_4_ = INFINITY;
        local_1c08._8_4_ = INFINITY;
        local_1c08._12_4_ = INFINITY;
        aStack_1bf8.m128[0] = -INFINITY;
        aStack_1bf8.m128[1] = -INFINITY;
        aStack_1bf8.m128[2] = -INFINITY;
        aStack_1bf8.m128[3] = -INFINITY;
        local_1be8.m128[0] = INFINITY;
        local_1be8.m128[1] = INFINITY;
        local_1be8._8_8_ = 0x7f8000007f800000;
        aStack_1bd8._0_8_ = 0xff800000ff800000;
        aStack_1bd8._8_8_ = 0xff800000ff800000;
        local_1c28._0_8_ = v2.field_0.v[0];
        local_1c28._8_8_ = v2.field_0.v[1];
        sStack_1bb8 = 0;
        sStack_1bb0 = 0;
        auStack_1ba8._0_4_ = (float)(lVar41 << 0x20);
        auStack_1ba8._4_4_ = SUB84(lVar41 << 0x20,4);
        auStack_1ba8 = auVar68;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = auStack_1ba8._8_8_;
        auVar68 = vcmpps_avx(auVar75,auVar67,1);
        auVar70 = vinsertps_avx(auVar67,auVar75,0x50);
        auVar69 = vinsertps_avx(auVar75,auVar67,0x50);
        auVar68 = vblendvps_avx(auVar69,auVar70,auVar68);
        uVar6 = vmovlps_avx(auVar68);
        auStack_1ba8._8_8_ = uVar6;
        local_1b28._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1b28._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        uStack_1b10 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[2]);
        uStack_1b18 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                      field_0._0_8_;
        local_1b08 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[0]);
        uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[2]);
        uStack_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        *(size_t *)local_1b48 = right.num_time_segments;
        *(size_t *)((long)local_1b48 + 8) = right.max_num_time_segments;
        *(size_t *)((long)local_1b48 + 0x10) =
             CONCAT44(right.max_time_range.upper,right.max_time_range.lower);
        *(size_t *)((long)local_1b48 + 0x18) =
             CONCAT44(right.time_range.upper,right.time_range.lower);
        auVar76._8_8_ = 0;
        auVar76._0_8_ = auStack_1aa8._8_8_;
        auVar68 = vcmpps_avx(auVar76,auVar67,1);
        auVar70 = vinsertps_avx(auVar67,auVar76,0x50);
        auVar69 = vinsertps_avx(auVar76,auVar67,0x50);
        auVar68 = vblendvps_avx(auVar69,auVar70,auVar68);
        uVar6 = vmovlps_avx(auVar68);
        auStack_1aa8._8_8_ = uVar6;
        local_1bc8 = BVar9;
        local_1ac8 = sStack_1bc0;
        sStack_1ac0 = sVar46;
        local_1a98 = local_1b98;
LAB_014128dd:
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      }
      else {
        this_01 = &local_17b8 + uVar63 * 0xf;
        if (iVar7 != 2) {
          if (iVar7 == 1) {
            SetMB::deterministic_order((SetMB *)&this_01->field_1);
            splitFallback(this,(SetMB *)&this_01->field_1,(SetMB *)local_1c28,
                          (SetMB *)&local_1b28.field_1);
          }
          else if (iVar7 == 3) {
            SetMB::deterministic_order((SetMB *)&this_01->field_1);
            splitByGeometry(this,(SetMB *)&this_01->field_1,(SetMB *)local_1c28,
                            (SetMB *)&local_1b28.field_1);
          }
          goto LAB_014128dd;
        }
        time_range1.lower = *(float *)(local_1708 + uVar63 * 0x1e + -1);
        time_range0.lower = local_1728[uVar63 * 0x1e + -1].lower;
        time_range1.upper = local_1728[uVar63 * 0x1e + -1].upper;
        BVar9 = local_1728[uVar63 * 0x1e];
        time_range0.upper = time_range1.lower;
        BVar40 = (BBox1f)operator_new(0x28);
        pMVar10 = (this->heuristicTemporalSplit).device;
        lVar41 = *(long *)(local_1768 + (uVar63 * 0x1e + 2) * 8 + 8);
        *(MemoryMonitorInterface **)BVar40 = pMVar10;
        *(undefined1 *)((long)BVar40 + 8) = 0;
        *(long *)((long)BVar40 + 0x10) = 0;
        *(long *)((long)BVar40 + 0x18) = 0;
        *(long *)((long)BVar40 + 0x20) = 0;
        lVar41 = lVar41 - *(long *)(local_1768 + (uVar63 * 0x1e + 1) * 8 + 8);
        if (lVar41 != 0) {
          uVar55 = lVar41 * 0x50;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar55,0);
          if (uVar55 < 0x1c00000) {
            pvVar42 = alignedMalloc(uVar55,0x10);
          }
          else {
            pvVar42 = os_malloc(uVar55,(bool *)((long)BVar40 + 8));
          }
          *(void **)((long)BVar40 + 0x20) = pvVar42;
          *(long *)((long)BVar40 + 0x10) = lVar41;
          *(long *)((long)BVar40 + 0x18) = lVar41;
        }
        pvVar34 = isLeft.vSplitPos;
        vSplitMask.field_0._8_8_ = &time_range0;
        pSVar11 = *(Split **)(local_1768 + (uVar63 * 0x1e + 1) * 8 + 8);
        pvVar12 = *(vint **)(local_1768 + (uVar63 * 0x1e + 2) * 8 + 8);
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = 0x7f8000007f800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_
             = 0xff800000ff800000;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [0] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [1] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [2] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128
        [3] = INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [0] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [1] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [2] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128
        [3] = -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
             INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
             -INFINITY;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
             -INFINITY;
        right.max_time_range.lower = 0.0;
        right.object_range._begin = 0;
        right.object_range._end = 0;
        right.num_time_segments = 0;
        right.max_num_time_segments = 0;
        auVar68._8_4_ = 0x3f800000;
        auVar68._0_8_ = &DAT_3f8000003f800000;
        auVar68._12_4_ = 0x3f800000;
        uVar6 = vmovlps_avx(auVar68);
        right.max_time_range.upper = (float)uVar6;
        right.time_range.lower = (float)((ulong)uVar6 >> 0x20);
        right.time_range.upper = 0.0;
        new_vector._M_t.
        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        .
        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
                )BVar40;
        vSplitMask.field_0._0_8_ = BVar9;
        if ((ulong)((long)pvVar12 - (long)pSVar11) < 0xc00) {
          isLeft.split = pSVar11;
          isLeft.vSplitPos = pvVar12;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)&v2,(anon_class_40_5_808acc65 *)&vSplitMask,
                     (range<unsigned_long> *)&isLeft);
        }
        else {
          isLeft.vSplitPos._6_2_ = SUB82(pvVar34,6);
          isLeft.vSplitPos._0_6_ = CONCAT15(4,CONCAT14(1,isLeft.vSplitPos._0_4_));
          tbb::detail::r1::initialize((task_group_context *)&isLeft);
          _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          vSplitPos.field_0.v[0] = (longlong)pvVar12;
          vSplitPos.field_0.v[1] = (longlong)pSVar11;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMB *)&v2,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&right,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                     (anon_class_16_2_ed117de8_conflict29 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&isLeft,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
          if (cVar36 != '\0') {
            prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar48,"task cancelled");
            __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&isLeft);
        }
        if (sStack_1c80 - (long)local_1c88 !=
            *(long *)(local_1768 + (uVar63 * 0x1e + 2) * 8 + 8) -
            *(long *)(local_1768 + (uVar63 * 0x1e + 1) * 8 + 8)) {
          right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
          _0_8_ = &time_range0;
          sStack_1c80 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                  (*(PrimRefMB **)((long)BVar40 + 0x20),0,
                                   *(long *)(local_1768 + (uVar63 * 0x1e + 2) * 8 + 8) -
                                   *(long *)(local_1768 + (uVar63 * 0x1e + 1) * 8 + 8),0x400,
                                   (anon_class_8_1_41ce32a5 *)&right);
        }
        uVar6 = vSplitPos.field_0.v[1];
        auVar69._4_4_ = time_range0.upper;
        auVar69._0_4_ = time_range0.lower;
        auVar69._8_8_ = 0;
        auStack_1c18._4_4_ = aStack_1cd8.m128[1];
        auStack_1c18._0_4_ = aStack_1cd8.m128[0];
        auStack_1c18._12_4_ = aStack_1cd8.m128[3];
        auStack_1c18._8_4_ = aStack_1cd8.m128[2];
        local_1c08._4_4_ = local_1cc8.i[1];
        local_1c08._0_4_ = local_1cc8.i[0];
        local_1c08._12_4_ = local_1cc8.i[3];
        local_1c08._8_4_ = local_1cc8.i[2];
        aStack_1bf8.m128[1] = (float)aStack_1cb8.i[1];
        aStack_1bf8.m128[0] = (float)aStack_1cb8.i[0];
        aStack_1bf8.m128[3] = (float)aStack_1cb8.i[3];
        aStack_1bf8.m128[2] = (float)aStack_1cb8.i[2];
        local_1be8.m128[1] = local_1ca8.m128[1];
        local_1be8.m128[0] = local_1ca8.m128[0];
        local_1be8._8_8_ = CONCAT44(local_1ca8.m128[3],local_1ca8.m128[2]);
        aStack_1bd8._0_8_ = CONCAT44(aStack_1c98.m128[1],aStack_1c98.m128[0]);
        aStack_1bd8._8_8_ = CONCAT44(aStack_1c98.m128[3],aStack_1c98.m128[2]);
        sStack_1bb8 = sStack_1c78;
        sStack_1bb0 = sStack_1c70;
        local_1c28._0_8_ = v2.field_0.v[0];
        local_1c28._8_8_ = v2.field_0.v[1];
        local_1bc8 = local_1c88;
        sStack_1bc0 = sStack_1c80;
        auVar77._4_4_ = fStack_1c64;
        auVar77._0_4_ = local_1c68;
        auVar77._8_8_ = 0;
        auVar85._4_4_ = fStack_1c5c;
        auVar85._0_4_ = fStack_1c60;
        auVar85._8_8_ = 0;
        auVar68 = vcmpps_avx(auVar85,auVar69,1);
        auVar70 = vinsertps_avx(auVar69,auVar85,0x50);
        auVar69 = vinsertps_avx(auVar85,auVar69,0x50);
        auVar68 = vblendvps_avx(auVar69,auVar70,auVar68);
        auStack_1ba8 = vmovlhps_avx(auVar77,auVar68);
        pcVar13 = *(code **)(local_1768 + (uVar63 * 0x1e + 2) * 8 + 8);
        isLeft.split = (Split *)0x7f8000007f800000;
        isLeft.vSplitPos = (vint *)0x7f8000007f800000;
        isLeft.vSplitMask = (vbool *)0xff800000ff800000;
        auVar70._8_4_ = 0x3f800000;
        auVar70._0_8_ = &DAT_3f8000003f800000;
        auVar70._12_4_ = 0x3f800000;
        vmovlps_avx(auVar70);
        local_1b98 = BVar40;
        _reduction2 = BVar9;
        if ((ulong)((long)pcVar13 - *(long *)(local_1768 + (uVar63 * 0x1e + 1) * 8 + 8)) < 0xc00) {
          vSplitPos.field_0.v[0] = *(long *)(local_1768 + (uVar63 * 0x1e + 1) * 8 + 8);
          vSplitPos.field_0.v[1] = (longlong)pcVar13;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    (&right,(anon_class_24_3_35f68c7c *)&reduction2,
                     (range<unsigned_long> *)&vSplitPos);
        }
        else {
          vSplitPos.field_0.v[1]._4_1_ = 1;
          vSplitPos.field_0.v[1]._6_2_ = SUB82(uVar6,6);
          vSplitPos.field_0.v[1]._5_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)&vSplitPos);
          local_19e8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_19e8._8_8_ = &reduction2;
          _reduction = pcVar13;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    (&right,(d1 *)&reduction,(blocked_range<unsigned_long> *)&isLeft,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_19e8,
                     (anon_class_16_2_ed117de8_conflict30 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)&vSplitPos,
                     (task_group_context *)
                     new_vector._M_t.
                     super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                     .
                     super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                     ._M_head_impl);
          cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
          if (cVar36 != '\0') {
            prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar48,"task cancelled");
            __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)&vSplitPos);
        }
        lVar41 = right.object_range._end - right.object_range._begin;
        right.object_range._begin = *(unsigned_long *)(local_1768 + (uVar63 * 0x1e + 1) * 8 + 8);
        right.object_range._end = lVar41 + right.object_range._begin;
        if (lVar41 != *(unsigned_long *)(local_1768 + (uVar63 * 0x1e + 2) * 8 + 8) -
                      right.object_range._begin) {
          isLeft.split = (Split *)&time_range1;
          right.object_range._end =
               parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                         (*(PrimRefMB **)((long)BVar9 + 0x20),right.object_range._begin,
                          *(unsigned_long *)(local_1768 + (uVar63 * 0x1e + 2) * 8 + 8),0x400,
                          (anon_class_8_1_41ce32a6 *)&isLeft);
        }
        auVar71._4_4_ = time_range1.upper;
        auVar71._0_4_ = time_range1.lower;
        auVar71._8_8_ = 0;
        local_1b28._0_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        local_1b28._8_8_ =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _8_8_;
        uStack_1b18 = right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                      field_0._0_8_;
        uStack_1b10 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds0.upper.field_0.m128[2]);
        local_1b08 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                              bounds1.lower.field_0.m128[0]);
        uStack_1b00 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.lower.field_0.m128[2]);
        uStack_1af8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[0]);
        uStack_1af0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                               bounds1.upper.field_0.m128[2]);
        local_1ae8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[1],
                              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
                              field_0.m128[0]);
        uStack_1ae0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower
                               .field_0.m128[2]);
        uStack_1ad8 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[1],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[0]);
        uStack_1ad0 = CONCAT44(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[3],
                               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper
                               .field_0.m128[2]);
        auVar25._8_8_ = right.max_num_time_segments;
        auVar25._0_8_ = right.num_time_segments;
        *local_1b48 = auVar25;
        local_1ac8 = right.object_range._begin;
        sStack_1ac0 = right.object_range._end;
        auVar78._4_4_ = right.time_range.upper;
        auVar78._0_4_ = right.time_range.lower;
        auVar78._8_8_ = 0;
        auVar68 = vcmpps_avx(auVar78,auVar71,1);
        auVar70 = vinsertps_avx(auVar71,auVar78,0x50);
        auVar69 = vinsertps_avx(auVar78,auVar71,0x50);
        auVar68 = vblendvps_avx(auVar69,auVar70,auVar68);
        auVar79._4_4_ = right.max_time_range.upper;
        auVar79._0_4_ = right.max_time_range.lower;
        auVar79._8_8_ = 0;
        auStack_1aa8 = vmovlhps_avx(auVar79,auVar68);
        local_1a98 = BVar9;
      }
      bVar65 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      findFallback((Split *)&v2,this,(SetMB *)local_1c28);
      local_1b78 = CONCAT44(aStack_1cd8.m128[1],aStack_1cd8.m128[0]);
      local_1b68 = CONCAT44(local_1cc8.i[1],local_1cc8.i[0]);
      sStack_1b60 = CONCAT44(local_1cc8.i[3],local_1cc8.i[2]);
      sStack_1b58 = CONCAT44(aStack_1cb8.i[1],aStack_1cb8.i[0]);
      sStack_1b50 = CONCAT44(aStack_1cb8.i[3],aStack_1cb8.i[2]);
      findFallback((Split *)&v2,this,(SetMB *)&local_1b28.field_1);
      lVar41 = local_640;
      local_1a78 = CONCAT44(aStack_1cd8.m128[1],aStack_1cd8.m128[0]);
      local_1a68 = CONCAT44(local_1cc8.i[1],local_1cc8.i[0]);
      sStack_1a60 = CONCAT44(local_1cc8.i[3],local_1cc8.i[2]);
      sStack_1a58 = CONCAT44(aStack_1cb8.i[1],aStack_1cb8.i[0]);
      sStack_1a50 = CONCAT44(aStack_1cb8.i[3],aStack_1cb8.i[2]);
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )0x0;
      pBVar49 = local_8c8[uVar63];
      if (local_1b98 == *pBVar49) {
        pBVar49[1] = (BBox1f)((long)pBVar49[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar41 * 2 + -1] = local_1b98;
        local_838[lVar41 * 2].lower = 1.4013e-45;
        local_838[lVar41 * 2].upper = 0.0;
        local_8c8[uVar63] = local_838 + lVar41 * 2 + -1;
      }
      lVar41 = local_640;
      if (local_1a98 == *pBVar49) {
        local_8c8[local_848] = pBVar49;
        pBVar49[1] = (BBox1f)((long)pBVar49[1] + 1);
      }
      else {
        local_640 = local_640 + 1;
        local_838[lVar41 * 2 + -1] = local_1a98;
        local_838[lVar41 * 2].lower = 1.4013e-45;
        local_838[lVar41 * 2].upper = 0.0;
        local_8c8[local_848] = local_838 + lVar41 * 2 + -1;
      }
      pBVar16 = pBVar49 + 1;
      *pBVar16 = (BBox1f)((long)*pBVar16 + -1);
      if ((*pBVar16 == (BBox1f)0x0) && (BVar9 = *pBVar49, BVar9 != (BBox1f)0x0)) {
        lVar41 = *(long *)((long)BVar9 + 0x18);
        pvVar42 = *(void **)((long)BVar9 + 0x20);
        if (pvVar42 != (void *)0x0) {
          if ((ulong)(lVar41 * 0x50) < 0x1c00000) {
            alignedFree(pvVar42);
          }
          else {
            os_free(pvVar42,lVar41 * 0x50,*(bool *)((long)BVar9 + 8));
          }
        }
        if (lVar41 != 0) {
          (**(code **)**(undefined8 **)BVar9)(*(undefined8 **)BVar9,lVar41 * -0x50,1);
        }
        *(undefined8 *)((long)BVar9 + 0x10) = 0;
        *(undefined8 *)((long)BVar9 + 0x18) = 0;
        *(undefined8 *)((long)BVar9 + 0x20) = 0;
        operator_delete((void *)BVar9);
      }
      uVar55 = local_848;
      auVar70 = auStack_1aa8;
      auVar68 = auStack_1ba8;
      (&geomID)[uVar63 * 0xf].field_0.v[0] = v0.field_0.v[0];
      *(undefined8 *)(&local_17b8 + uVar63 * 0xf) = local_1c28._0_8_;
      *(undefined8 *)(local_17a8 + uVar63 * 0xf0 + -8) = local_1c28._8_8_;
      ((BBox1f *)(local_17a8 + uVar63 * 0xf0))->lower = (float)auStack_1c18._0_4_;
      ((BBox1f *)(local_17a8 + uVar63 * 0xf0))->upper = (float)auStack_1c18._4_4_;
      ((BBox1f *)(auStack_1798 + lVar38 + -8))->lower = (float)auStack_1c18._8_4_;
      ((BBox1f *)(auStack_1798 + lVar38 + -8))->upper = (float)auStack_1c18._12_4_;
      ((BBox1f *)(auStack_1798 + lVar38))->lower = (float)local_1c08._0_4_;
      ((BBox1f *)(auStack_1798 + lVar38))->upper = (float)local_1c08._4_4_;
      ((BBox1f *)(auStack_1798 + lVar38 + 8))->lower = (float)local_1c08._8_4_;
      ((BBox1f *)(auStack_1798 + lVar38 + 8))->upper = (float)local_1c08._12_4_;
      ((BBox1f *)(local_1788 + lVar38))->lower = (float)aStack_1bf8._0_4_;
      ((BBox1f *)(local_1788 + lVar38))->upper = aStack_1bf8.m128[1];
      ((BBox1f *)(local_1788 + lVar38 + 8))->lower = (float)aStack_1bf8._8_4_;
      ((BBox1f *)(local_1788 + lVar38 + 8))->upper = aStack_1bf8.m128[3];
      *(undefined8 *)(&local_1778 + uVar63 * 0xf) = local_1be8._0_8_;
      *(undefined8 *)((long)&local_1778 + lVar38 + 8) = local_1be8._8_8_;
      *(undefined8 *)(local_1768 + uVar63 * 0xf0) = aStack_1bd8._0_8_;
      *(undefined8 *)(local_1768 + uVar63 * 0xf0 + 8) = aStack_1bd8._8_8_;
      *(BBox1f *)(local_1768 + (uVar63 * 0x1e + 1) * 8 + 8) = local_1bc8;
      *(size_t *)(local_1768 + (uVar63 * 0x1e + 2) * 8 + 8) = sStack_1bc0;
      asStack_1748[uVar63 * 0x1e] = sStack_1bb8;
      asStack_1748[uVar63 * 0x1e + 1] = sStack_1bb0;
      (&local_1738)[uVar63 * 0x1e].lower = (float)auStack_1ba8._0_4_;
      (&local_1738)[uVar63 * 0x1e].upper = (float)auStack_1ba8._4_4_;
      local_1728[uVar63 * 0x1e + -1].lower = (float)auStack_1ba8._8_4_;
      local_1728[uVar63 * 0x1e + -1].upper = (float)auStack_1ba8._12_4_;
      local_1728[uVar63 * 0x1e] = local_1b98;
      pSVar2->sah = (float)(undefined4)local_1b88;
      pSVar2->dim = local_1b88._4_4_;
      local_1708[uVar63 * 0x1e + -1] = sStack_1b80;
      local_1708[uVar63 * 0x1e] = local_1b78;
      local_1708[uVar63 * 0x1e + 2] = local_1b68;
      local_1708[uVar63 * 0x1e + 3] = sStack_1b60;
      local_1708[uVar63 * 0x1e + 4] = sStack_1b58;
      local_1708[uVar63 * 0x1e + 5] = sStack_1b50;
      lVar38 = local_848 * 0xf0;
      (&geomID)[local_848 * 0xf].field_0.v[0] = v1.field_0.v[0];
      *(undefined8 *)(&local_17b8 + uVar55 * 0xf) = local_1b28._0_8_;
      *(undefined8 *)(local_17a8 + uVar55 * 0xf0 + -8) = local_1b28._8_8_;
      *(undefined8 *)(local_17a8 + uVar55 * 0xf0) = uStack_1b18;
      *(undefined8 *)(auStack_1798 + lVar38 + -8) = uStack_1b10;
      *(undefined8 *)(auStack_1798 + lVar38) = local_1b08;
      *(undefined8 *)(auStack_1798 + lVar38 + 8) = uStack_1b00;
      *(undefined8 *)(local_1788 + lVar38) = uStack_1af8;
      *(undefined8 *)(local_1788 + lVar38 + 8) = uStack_1af0;
      *(undefined8 *)(&local_1778 + uVar55 * 0xf) = local_1ae8;
      *(undefined8 *)((long)&local_1778 + lVar38 + 8) = uStack_1ae0;
      *(undefined8 *)(local_1768 + uVar55 * 0xf0) = uStack_1ad8;
      *(undefined8 *)(local_1768 + uVar55 * 0xf0 + 8) = uStack_1ad0;
      *(size_t *)(local_1768 + (uVar55 * 0x1e + 1) * 8 + 8) = local_1ac8;
      *(size_t *)(local_1768 + (uVar55 * 0x1e + 2) * 8 + 8) = sStack_1ac0;
      asStack_1748[uVar55 * 0x1e] = sStack_1ab8;
      asStack_1748[uVar55 * 0x1e + 1] = sStack_1ab0;
      (&local_1738)[uVar55 * 0x1e].lower = (float)auStack_1aa8._0_4_;
      (&local_1738)[uVar55 * 0x1e].upper = (float)auStack_1aa8._4_4_;
      local_1728[uVar55 * 0x1e + -1].lower = (float)auStack_1aa8._8_4_;
      local_1728[uVar55 * 0x1e + -1].upper = (float)auStack_1aa8._12_4_;
      local_1728[uVar55 * 0x1e] = local_1a98;
      *(undefined8 *)(local_1718 + uVar55 * 0xf0) = local_1a88;
      local_1708[uVar55 * 0x1e + -1] = sStack_1a80;
      local_1708[uVar55 * 0x1e] = local_1a78;
      local_1708[uVar55 * 0x1e + 2] = local_1a68;
      local_1708[uVar55 * 0x1e + 3] = sStack_1a60;
      local_1708[uVar55 * 0x1e + 4] = sStack_1a58;
      local_1708[uVar55 * 0x1e + 5] = sStack_1a50;
      local_848 = local_848 + 1;
      auStack_1ba8 = auVar68;
      auStack_1aa8 = auVar70;
      if ((__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
           )0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&new_vector,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)new_vector._M_t.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl);
      }
      bVar35 = bVar35 | bVar65;
    }
  } while ((uVar63 != 0xffffffffffffffff) && (local_848 < (this->cfg).branchingFactor));
  if (local_848 != 0) {
    puVar50 = &uStack_172c;
    uVar43 = local_848;
    do {
      auVar68 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                           ZEXT416(puVar50[-1]),1);
      auVar70 = vcmpps_avx(ZEXT416(*puVar50),
                           ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
      auVar68 = vorps_avx(auVar68,auVar70);
      bVar35 = bVar35 | auVar68[0];
      puVar50 = puVar50 + 0x3c;
      uVar43 = uVar43 - 1;
    } while (uVar43 != 0);
  }
  if ((bVar35 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0x1c0;
    pTVar14 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar14->alloc)._M_b._M_p) {
      v1.field_0.v[1]._0_1_ = 1;
      v1.field_0.v[0] = (longlong)pTVar14;
      MutexSys::lock(&pTVar14->mutex);
      if ((pTVar14->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar14->alloc1).bytesUsed + (pTVar14->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar14->alloc0).end + (pTVar14->alloc1).end) -
             ((pTVar14->alloc0).cur + (pTVar14->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar14->alloc1).bytesWasted + (pTVar14->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar74 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar14->alloc0).end = auVar74._0_8_;
      (pTVar14->alloc0).allocBlockSize = auVar74._8_8_;
      (pTVar14->alloc0).bytesUsed = auVar74._16_8_;
      (pTVar14->alloc0).bytesWasted = auVar74._24_8_;
      (pTVar14->alloc0).ptr = (char *)auVar74._0_8_;
      (pTVar14->alloc0).cur = auVar74._8_8_;
      (pTVar14->alloc0).end = auVar74._16_8_;
      (pTVar14->alloc0).allocBlockSize = auVar74._24_8_;
      auVar74 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar14->alloc1).end = auVar74._0_8_;
        (pTVar14->alloc1).allocBlockSize = auVar74._8_8_;
        (pTVar14->alloc1).bytesUsed = auVar74._16_8_;
        (pTVar14->alloc1).bytesWasted = auVar74._24_8_;
        (pTVar14->alloc1).ptr = (char *)auVar74._0_8_;
        (pTVar14->alloc1).cur = auVar74._8_8_;
        (pTVar14->alloc1).end = auVar74._16_8_;
        (pTVar14->alloc1).allocBlockSize = auVar74._24_8_;
      }
      else {
        (pTVar14->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar14->alloc1).ptr = (char *)auVar74._0_8_;
        (pTVar14->alloc1).cur = auVar74._8_8_;
        (pTVar14->alloc1).end = auVar74._16_8_;
        (pTVar14->alloc1).allocBlockSize = auVar74._24_8_;
        (pTVar14->alloc1).end = auVar74._0_8_;
        (pTVar14->alloc1).allocBlockSize = auVar74._8_8_;
        (pTVar14->alloc1).bytesUsed = auVar74._16_8_;
        (pTVar14->alloc1).bytesWasted = auVar74._24_8_;
        (pTVar14->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar14->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v2.field_0.v[0] = (longlong)pTVar14;
      v0.field_0.v[1]._0_1_ = 1;
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar15._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar15,(ThreadLocal2 **)&v2);
      }
      else {
        *iVar15._M_current = (ThreadLocal2 *)v2.field_0.v[0];
        pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar4 = *pppTVar4 + 1;
      }
      if (v0.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v0.field_0.v[0]);
      }
      if (v1.field_0.v[1]._0_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)v1.field_0.v[0]);
      }
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar46 = (alloc.talloc0)->cur;
    uVar43 = (ulong)(-(int)sVar46 & 0x1f);
    uVar63 = sVar46 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar43;
    (alloc.talloc0)->cur = uVar63;
    if ((alloc.talloc0)->end < uVar63) {
      (alloc.talloc0)->cur = sVar46;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar54;
        sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar46;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc0)->ptr = pcVar54;
          sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar46;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = v0.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v0.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar54 = (char *)0x0;
            goto LAB_01413a56;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar46;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar43;
      pcVar54 = (alloc.talloc0)->ptr +
                (uVar63 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_01413a56:
    pcVar54[0xc0] = '\0';
    pcVar54[0xc1] = '\0';
    pcVar54[0xc2] = -0x80;
    pcVar54[0xc3] = '\x7f';
    pcVar54[0xc4] = '\0';
    pcVar54[0xc5] = '\0';
    pcVar54[0xc6] = -0x80;
    pcVar54[199] = '\x7f';
    pcVar54[200] = '\0';
    pcVar54[0xc9] = '\0';
    pcVar54[0xca] = -0x80;
    pcVar54[0xcb] = '\x7f';
    pcVar54[0xcc] = '\0';
    pcVar54[0xcd] = '\0';
    pcVar54[0xce] = -0x80;
    pcVar54[0xcf] = '\x7f';
    pcVar54[0xd0] = '\0';
    pcVar54[0xd1] = '\0';
    pcVar54[0xd2] = -0x80;
    pcVar54[0xd3] = '\x7f';
    pcVar54[0xd4] = '\0';
    pcVar54[0xd5] = '\0';
    pcVar54[0xd6] = -0x80;
    pcVar54[0xd7] = '\x7f';
    pcVar54[0xd8] = '\0';
    pcVar54[0xd9] = '\0';
    pcVar54[0xda] = -0x80;
    pcVar54[0xdb] = '\x7f';
    pcVar54[0xdc] = '\0';
    pcVar54[0xdd] = '\0';
    pcVar54[0xde] = -0x80;
    pcVar54[0xdf] = '\x7f';
    pcVar54[0x80] = '\0';
    pcVar54[0x81] = '\0';
    pcVar54[0x82] = -0x80;
    pcVar54[0x83] = '\x7f';
    pcVar54[0x84] = '\0';
    pcVar54[0x85] = '\0';
    pcVar54[0x86] = -0x80;
    pcVar54[0x87] = '\x7f';
    pcVar54[0x88] = '\0';
    pcVar54[0x89] = '\0';
    pcVar54[0x8a] = -0x80;
    pcVar54[0x8b] = '\x7f';
    pcVar54[0x8c] = '\0';
    pcVar54[0x8d] = '\0';
    pcVar54[0x8e] = -0x80;
    pcVar54[0x8f] = '\x7f';
    pcVar54[0x90] = '\0';
    pcVar54[0x91] = '\0';
    pcVar54[0x92] = -0x80;
    pcVar54[0x93] = '\x7f';
    pcVar54[0x94] = '\0';
    pcVar54[0x95] = '\0';
    pcVar54[0x96] = -0x80;
    pcVar54[0x97] = '\x7f';
    pcVar54[0x98] = '\0';
    pcVar54[0x99] = '\0';
    pcVar54[0x9a] = -0x80;
    pcVar54[0x9b] = '\x7f';
    pcVar54[0x9c] = '\0';
    pcVar54[0x9d] = '\0';
    pcVar54[0x9e] = -0x80;
    pcVar54[0x9f] = '\x7f';
    pcVar54[0x40] = '\0';
    pcVar54[0x41] = '\0';
    pcVar54[0x42] = -0x80;
    pcVar54[0x43] = '\x7f';
    pcVar54[0x44] = '\0';
    pcVar54[0x45] = '\0';
    pcVar54[0x46] = -0x80;
    pcVar54[0x47] = '\x7f';
    pcVar54[0x48] = '\0';
    pcVar54[0x49] = '\0';
    pcVar54[0x4a] = -0x80;
    pcVar54[0x4b] = '\x7f';
    pcVar54[0x4c] = '\0';
    pcVar54[0x4d] = '\0';
    pcVar54[0x4e] = -0x80;
    pcVar54[0x4f] = '\x7f';
    pcVar54[0x50] = '\0';
    pcVar54[0x51] = '\0';
    pcVar54[0x52] = -0x80;
    pcVar54[0x53] = '\x7f';
    pcVar54[0x54] = '\0';
    pcVar54[0x55] = '\0';
    pcVar54[0x56] = -0x80;
    pcVar54[0x57] = '\x7f';
    pcVar54[0x58] = '\0';
    pcVar54[0x59] = '\0';
    pcVar54[0x5a] = -0x80;
    pcVar54[0x5b] = '\x7f';
    pcVar54[0x5c] = '\0';
    pcVar54[0x5d] = '\0';
    pcVar54[0x5e] = -0x80;
    pcVar54[0x5f] = '\x7f';
    pcVar54[0xe0] = '\0';
    pcVar54[0xe1] = '\0';
    pcVar54[0xe2] = -0x80;
    pcVar54[0xe3] = -1;
    pcVar54[0xe4] = '\0';
    pcVar54[0xe5] = '\0';
    pcVar54[0xe6] = -0x80;
    pcVar54[0xe7] = -1;
    pcVar54[0xe8] = '\0';
    pcVar54[0xe9] = '\0';
    pcVar54[0xea] = -0x80;
    pcVar54[0xeb] = -1;
    pcVar54[0xec] = '\0';
    pcVar54[0xed] = '\0';
    pcVar54[0xee] = -0x80;
    pcVar54[0xef] = -1;
    pcVar54[0xf0] = '\0';
    pcVar54[0xf1] = '\0';
    pcVar54[0xf2] = -0x80;
    pcVar54[0xf3] = -1;
    pcVar54[0xf4] = '\0';
    pcVar54[0xf5] = '\0';
    pcVar54[0xf6] = -0x80;
    pcVar54[0xf7] = -1;
    pcVar54[0xf8] = '\0';
    pcVar54[0xf9] = '\0';
    pcVar54[0xfa] = -0x80;
    pcVar54[0xfb] = -1;
    pcVar54[0xfc] = '\0';
    pcVar54[0xfd] = '\0';
    pcVar54[0xfe] = -0x80;
    pcVar54[0xff] = -1;
    pcVar54[0xa0] = '\0';
    pcVar54[0xa1] = '\0';
    pcVar54[0xa2] = -0x80;
    pcVar54[0xa3] = -1;
    pcVar54[0xa4] = '\0';
    pcVar54[0xa5] = '\0';
    pcVar54[0xa6] = -0x80;
    pcVar54[0xa7] = -1;
    pcVar54[0xa8] = '\0';
    pcVar54[0xa9] = '\0';
    pcVar54[0xaa] = -0x80;
    pcVar54[0xab] = -1;
    pcVar54[0xac] = '\0';
    pcVar54[0xad] = '\0';
    pcVar54[0xae] = -0x80;
    pcVar54[0xaf] = -1;
    pcVar54[0xb0] = '\0';
    pcVar54[0xb1] = '\0';
    pcVar54[0xb2] = -0x80;
    pcVar54[0xb3] = -1;
    pcVar54[0xb4] = '\0';
    pcVar54[0xb5] = '\0';
    pcVar54[0xb6] = -0x80;
    pcVar54[0xb7] = -1;
    pcVar54[0xb8] = '\0';
    pcVar54[0xb9] = '\0';
    pcVar54[0xba] = -0x80;
    pcVar54[0xbb] = -1;
    pcVar54[0xbc] = '\0';
    pcVar54[0xbd] = '\0';
    pcVar54[0xbe] = -0x80;
    pcVar54[0xbf] = -1;
    pcVar54[0x60] = '\0';
    pcVar54[0x61] = '\0';
    pcVar54[0x62] = -0x80;
    pcVar54[99] = -1;
    pcVar54[100] = '\0';
    pcVar54[0x65] = '\0';
    pcVar54[0x66] = -0x80;
    pcVar54[0x67] = -1;
    pcVar54[0x68] = '\0';
    pcVar54[0x69] = '\0';
    pcVar54[0x6a] = -0x80;
    pcVar54[0x6b] = -1;
    pcVar54[0x6c] = '\0';
    pcVar54[0x6d] = '\0';
    pcVar54[0x6e] = -0x80;
    pcVar54[0x6f] = -1;
    pcVar54[0x70] = '\0';
    pcVar54[0x71] = '\0';
    pcVar54[0x72] = -0x80;
    pcVar54[0x73] = -1;
    pcVar54[0x74] = '\0';
    pcVar54[0x75] = '\0';
    pcVar54[0x76] = -0x80;
    pcVar54[0x77] = -1;
    pcVar54[0x78] = '\0';
    pcVar54[0x79] = '\0';
    pcVar54[0x7a] = -0x80;
    pcVar54[0x7b] = -1;
    pcVar54[0x7c] = '\0';
    pcVar54[0x7d] = '\0';
    pcVar54[0x7e] = -0x80;
    pcVar54[0x7f] = -1;
    auVar74 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar54 + 0x100) = auVar74;
    *(undefined1 (*) [32])(pcVar54 + 0x120) = auVar74;
    auVar74 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar54 + 0x140) = auVar74;
    *(undefined1 (*) [32])(pcVar54 + 0x160) = auVar74;
    *(undefined1 (*) [32])(pcVar54 + 0x180) = auVar74;
    *(undefined1 (*) [32])(pcVar54 + 0x1a0) = auVar74;
    lVar38 = 0;
    do {
      pcVar3 = pcVar54 + lVar38 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      pcVar3[8] = '\b';
      pcVar3[9] = '\0';
      pcVar3[10] = '\0';
      pcVar3[0xb] = '\0';
      pcVar3[0xc] = '\0';
      pcVar3[0xd] = '\0';
      pcVar3[0xe] = '\0';
      pcVar3[0xf] = '\0';
      pcVar3[0x10] = '\b';
      pcVar3[0x11] = '\0';
      pcVar3[0x12] = '\0';
      pcVar3[0x13] = '\0';
      pcVar3[0x14] = '\0';
      pcVar3[0x15] = '\0';
      pcVar3[0x16] = '\0';
      pcVar3[0x17] = '\0';
      pcVar3[0x18] = '\b';
      pcVar3[0x19] = '\0';
      pcVar3[0x1a] = '\0';
      pcVar3[0x1b] = '\0';
      pcVar3[0x1c] = '\0';
      pcVar3[0x1d] = '\0';
      pcVar3[0x1e] = '\0';
      pcVar3[0x1f] = '\0';
      lVar38 = lVar38 + 4;
    } while (lVar38 != 8);
    uVar43 = 1;
    goto LAB_01413ae6;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x200;
  pTVar14 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar14->alloc)._M_b._M_p) {
    v1.field_0.v[1]._0_1_ = 1;
    v1.field_0.v[0] = (longlong)pTVar14;
    MutexSys::lock(&pTVar14->mutex);
    if ((pTVar14->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar14->alloc1).bytesUsed + (pTVar14->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar14->alloc0).end + (pTVar14->alloc1).end) -
           ((pTVar14->alloc0).cur + (pTVar14->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar14->alloc1).bytesWasted + (pTVar14->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar74 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar14->alloc0).end = auVar74._0_8_;
    (pTVar14->alloc0).allocBlockSize = auVar74._8_8_;
    (pTVar14->alloc0).bytesUsed = auVar74._16_8_;
    (pTVar14->alloc0).bytesWasted = auVar74._24_8_;
    (pTVar14->alloc0).ptr = (char *)auVar74._0_8_;
    (pTVar14->alloc0).cur = auVar74._8_8_;
    (pTVar14->alloc0).end = auVar74._16_8_;
    (pTVar14->alloc0).allocBlockSize = auVar74._24_8_;
    auVar74 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar14->alloc1).end = auVar74._0_8_;
      (pTVar14->alloc1).allocBlockSize = auVar74._8_8_;
      (pTVar14->alloc1).bytesUsed = auVar74._16_8_;
      (pTVar14->alloc1).bytesWasted = auVar74._24_8_;
      (pTVar14->alloc1).ptr = (char *)auVar74._0_8_;
      (pTVar14->alloc1).cur = auVar74._8_8_;
      (pTVar14->alloc1).end = auVar74._16_8_;
      (pTVar14->alloc1).allocBlockSize = auVar74._24_8_;
    }
    else {
      (pTVar14->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar14->alloc1).ptr = (char *)auVar74._0_8_;
      (pTVar14->alloc1).cur = auVar74._8_8_;
      (pTVar14->alloc1).end = auVar74._16_8_;
      (pTVar14->alloc1).allocBlockSize = auVar74._24_8_;
      (pTVar14->alloc1).end = auVar74._0_8_;
      (pTVar14->alloc1).allocBlockSize = auVar74._8_8_;
      (pTVar14->alloc1).bytesUsed = auVar74._16_8_;
      (pTVar14->alloc1).bytesWasted = auVar74._24_8_;
      (pTVar14->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar14->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v2.field_0.v[0] = (longlong)pTVar14;
    v0.field_0.v[1]._0_1_ = 1;
    v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar15._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar15._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar15,(ThreadLocal2 **)&v2);
    }
    else {
      *iVar15._M_current = (ThreadLocal2 *)v2.field_0.v[0];
      pppTVar4 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar4 = *pppTVar4 + 1;
    }
    if (v0.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)v0.field_0.v[0]);
    }
    if (v1.field_0.v[1]._0_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)v1.field_0.v[0]);
    }
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar46 = (alloc.talloc0)->cur;
  uVar43 = (ulong)(-(int)sVar46 & 0x1f);
  uVar63 = sVar46 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar43;
  (alloc.talloc0)->cur = uVar63;
  if ((alloc.talloc0)->end < uVar63) {
    (alloc.talloc0)->cur = sVar46;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
      (alloc.talloc0)->ptr = pcVar54;
      sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar46;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = v0.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)v0.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar54 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar54;
        sVar46 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar46;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar54 = (char *)0x0;
          goto LAB_01413937;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar46;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar43;
    pcVar54 = (alloc.talloc0)->ptr +
              (uVar63 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_01413937:
  pcVar54[0x1c0] = '\0';
  pcVar54[0x1c1] = '\0';
  pcVar54[0x1c2] = -0x80;
  pcVar54[0x1c3] = '\x7f';
  pcVar54[0x1c4] = '\0';
  pcVar54[0x1c5] = '\0';
  pcVar54[0x1c6] = -0x80;
  pcVar54[0x1c7] = '\x7f';
  pcVar54[0x1c8] = '\0';
  pcVar54[0x1c9] = '\0';
  pcVar54[0x1ca] = -0x80;
  pcVar54[0x1cb] = '\x7f';
  pcVar54[0x1cc] = '\0';
  pcVar54[0x1cd] = '\0';
  pcVar54[0x1ce] = -0x80;
  pcVar54[0x1cf] = '\x7f';
  pcVar54[0x1d0] = '\0';
  pcVar54[0x1d1] = '\0';
  pcVar54[0x1d2] = -0x80;
  pcVar54[0x1d3] = '\x7f';
  pcVar54[0x1d4] = '\0';
  pcVar54[0x1d5] = '\0';
  pcVar54[0x1d6] = -0x80;
  pcVar54[0x1d7] = '\x7f';
  pcVar54[0x1d8] = '\0';
  pcVar54[0x1d9] = '\0';
  pcVar54[0x1da] = -0x80;
  pcVar54[0x1db] = '\x7f';
  pcVar54[0x1dc] = '\0';
  pcVar54[0x1dd] = '\0';
  pcVar54[0x1de] = -0x80;
  pcVar54[0x1df] = '\x7f';
  pcVar54[0x1e0] = '\0';
  pcVar54[0x1e1] = '\0';
  pcVar54[0x1e2] = -0x80;
  pcVar54[0x1e3] = -1;
  pcVar54[0x1e4] = '\0';
  pcVar54[0x1e5] = '\0';
  pcVar54[0x1e6] = -0x80;
  pcVar54[0x1e7] = -1;
  pcVar54[0x1e8] = '\0';
  pcVar54[0x1e9] = '\0';
  pcVar54[0x1ea] = -0x80;
  pcVar54[0x1eb] = -1;
  pcVar54[0x1ec] = '\0';
  pcVar54[0x1ed] = '\0';
  pcVar54[0x1ee] = -0x80;
  pcVar54[0x1ef] = -1;
  pcVar54[0x1f0] = '\0';
  pcVar54[0x1f1] = '\0';
  pcVar54[0x1f2] = -0x80;
  pcVar54[499] = -1;
  pcVar54[500] = '\0';
  pcVar54[0x1f5] = '\0';
  pcVar54[0x1f6] = -0x80;
  pcVar54[0x1f7] = -1;
  pcVar54[0x1f8] = '\0';
  pcVar54[0x1f9] = '\0';
  pcVar54[0x1fa] = -0x80;
  pcVar54[0x1fb] = -1;
  pcVar54[0x1fc] = '\0';
  pcVar54[0x1fd] = '\0';
  pcVar54[0x1fe] = -0x80;
  pcVar54[0x1ff] = -1;
  pcVar54[0xc0] = '\0';
  pcVar54[0xc1] = '\0';
  pcVar54[0xc2] = -0x80;
  pcVar54[0xc3] = '\x7f';
  pcVar54[0xc4] = '\0';
  pcVar54[0xc5] = '\0';
  pcVar54[0xc6] = -0x80;
  pcVar54[199] = '\x7f';
  pcVar54[200] = '\0';
  pcVar54[0xc9] = '\0';
  pcVar54[0xca] = -0x80;
  pcVar54[0xcb] = '\x7f';
  pcVar54[0xcc] = '\0';
  pcVar54[0xcd] = '\0';
  pcVar54[0xce] = -0x80;
  pcVar54[0xcf] = '\x7f';
  pcVar54[0xd0] = '\0';
  pcVar54[0xd1] = '\0';
  pcVar54[0xd2] = -0x80;
  pcVar54[0xd3] = '\x7f';
  pcVar54[0xd4] = '\0';
  pcVar54[0xd5] = '\0';
  pcVar54[0xd6] = -0x80;
  pcVar54[0xd7] = '\x7f';
  pcVar54[0xd8] = '\0';
  pcVar54[0xd9] = '\0';
  pcVar54[0xda] = -0x80;
  pcVar54[0xdb] = '\x7f';
  pcVar54[0xdc] = '\0';
  pcVar54[0xdd] = '\0';
  pcVar54[0xde] = -0x80;
  pcVar54[0xdf] = '\x7f';
  pcVar54[0x80] = '\0';
  pcVar54[0x81] = '\0';
  pcVar54[0x82] = -0x80;
  pcVar54[0x83] = '\x7f';
  pcVar54[0x84] = '\0';
  pcVar54[0x85] = '\0';
  pcVar54[0x86] = -0x80;
  pcVar54[0x87] = '\x7f';
  pcVar54[0x88] = '\0';
  pcVar54[0x89] = '\0';
  pcVar54[0x8a] = -0x80;
  pcVar54[0x8b] = '\x7f';
  pcVar54[0x8c] = '\0';
  pcVar54[0x8d] = '\0';
  pcVar54[0x8e] = -0x80;
  pcVar54[0x8f] = '\x7f';
  pcVar54[0x90] = '\0';
  pcVar54[0x91] = '\0';
  pcVar54[0x92] = -0x80;
  pcVar54[0x93] = '\x7f';
  pcVar54[0x94] = '\0';
  pcVar54[0x95] = '\0';
  pcVar54[0x96] = -0x80;
  pcVar54[0x97] = '\x7f';
  pcVar54[0x98] = '\0';
  pcVar54[0x99] = '\0';
  pcVar54[0x9a] = -0x80;
  pcVar54[0x9b] = '\x7f';
  pcVar54[0x9c] = '\0';
  pcVar54[0x9d] = '\0';
  pcVar54[0x9e] = -0x80;
  pcVar54[0x9f] = '\x7f';
  pcVar54[0x40] = '\0';
  pcVar54[0x41] = '\0';
  pcVar54[0x42] = -0x80;
  pcVar54[0x43] = '\x7f';
  pcVar54[0x44] = '\0';
  pcVar54[0x45] = '\0';
  pcVar54[0x46] = -0x80;
  pcVar54[0x47] = '\x7f';
  pcVar54[0x48] = '\0';
  pcVar54[0x49] = '\0';
  pcVar54[0x4a] = -0x80;
  pcVar54[0x4b] = '\x7f';
  pcVar54[0x4c] = '\0';
  pcVar54[0x4d] = '\0';
  pcVar54[0x4e] = -0x80;
  pcVar54[0x4f] = '\x7f';
  pcVar54[0x50] = '\0';
  pcVar54[0x51] = '\0';
  pcVar54[0x52] = -0x80;
  pcVar54[0x53] = '\x7f';
  pcVar54[0x54] = '\0';
  pcVar54[0x55] = '\0';
  pcVar54[0x56] = -0x80;
  pcVar54[0x57] = '\x7f';
  pcVar54[0x58] = '\0';
  pcVar54[0x59] = '\0';
  pcVar54[0x5a] = -0x80;
  pcVar54[0x5b] = '\x7f';
  pcVar54[0x5c] = '\0';
  pcVar54[0x5d] = '\0';
  pcVar54[0x5e] = -0x80;
  pcVar54[0x5f] = '\x7f';
  pcVar54[0xe0] = '\0';
  pcVar54[0xe1] = '\0';
  pcVar54[0xe2] = -0x80;
  pcVar54[0xe3] = -1;
  pcVar54[0xe4] = '\0';
  pcVar54[0xe5] = '\0';
  pcVar54[0xe6] = -0x80;
  pcVar54[0xe7] = -1;
  pcVar54[0xe8] = '\0';
  pcVar54[0xe9] = '\0';
  pcVar54[0xea] = -0x80;
  pcVar54[0xeb] = -1;
  pcVar54[0xec] = '\0';
  pcVar54[0xed] = '\0';
  pcVar54[0xee] = -0x80;
  pcVar54[0xef] = -1;
  pcVar54[0xf0] = '\0';
  pcVar54[0xf1] = '\0';
  pcVar54[0xf2] = -0x80;
  pcVar54[0xf3] = -1;
  pcVar54[0xf4] = '\0';
  pcVar54[0xf5] = '\0';
  pcVar54[0xf6] = -0x80;
  pcVar54[0xf7] = -1;
  pcVar54[0xf8] = '\0';
  pcVar54[0xf9] = '\0';
  pcVar54[0xfa] = -0x80;
  pcVar54[0xfb] = -1;
  pcVar54[0xfc] = '\0';
  pcVar54[0xfd] = '\0';
  pcVar54[0xfe] = -0x80;
  pcVar54[0xff] = -1;
  pcVar54[0xa0] = '\0';
  pcVar54[0xa1] = '\0';
  pcVar54[0xa2] = -0x80;
  pcVar54[0xa3] = -1;
  pcVar54[0xa4] = '\0';
  pcVar54[0xa5] = '\0';
  pcVar54[0xa6] = -0x80;
  pcVar54[0xa7] = -1;
  pcVar54[0xa8] = '\0';
  pcVar54[0xa9] = '\0';
  pcVar54[0xaa] = -0x80;
  pcVar54[0xab] = -1;
  pcVar54[0xac] = '\0';
  pcVar54[0xad] = '\0';
  pcVar54[0xae] = -0x80;
  pcVar54[0xaf] = -1;
  pcVar54[0xb0] = '\0';
  pcVar54[0xb1] = '\0';
  pcVar54[0xb2] = -0x80;
  pcVar54[0xb3] = -1;
  pcVar54[0xb4] = '\0';
  pcVar54[0xb5] = '\0';
  pcVar54[0xb6] = -0x80;
  pcVar54[0xb7] = -1;
  pcVar54[0xb8] = '\0';
  pcVar54[0xb9] = '\0';
  pcVar54[0xba] = -0x80;
  pcVar54[0xbb] = -1;
  pcVar54[0xbc] = '\0';
  pcVar54[0xbd] = '\0';
  pcVar54[0xbe] = -0x80;
  pcVar54[0xbf] = -1;
  pcVar54[0x60] = '\0';
  pcVar54[0x61] = '\0';
  pcVar54[0x62] = -0x80;
  pcVar54[99] = -1;
  pcVar54[100] = '\0';
  pcVar54[0x65] = '\0';
  pcVar54[0x66] = -0x80;
  pcVar54[0x67] = -1;
  pcVar54[0x68] = '\0';
  pcVar54[0x69] = '\0';
  pcVar54[0x6a] = -0x80;
  pcVar54[0x6b] = -1;
  pcVar54[0x6c] = '\0';
  pcVar54[0x6d] = '\0';
  pcVar54[0x6e] = -0x80;
  pcVar54[0x6f] = -1;
  pcVar54[0x70] = '\0';
  pcVar54[0x71] = '\0';
  pcVar54[0x72] = -0x80;
  pcVar54[0x73] = -1;
  pcVar54[0x74] = '\0';
  pcVar54[0x75] = '\0';
  pcVar54[0x76] = -0x80;
  pcVar54[0x77] = -1;
  pcVar54[0x78] = '\0';
  pcVar54[0x79] = '\0';
  pcVar54[0x7a] = -0x80;
  pcVar54[0x7b] = -1;
  pcVar54[0x7c] = '\0';
  pcVar54[0x7d] = '\0';
  pcVar54[0x7e] = -0x80;
  pcVar54[0x7f] = -1;
  auVar74 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar54 + 0x100) = auVar74;
  *(undefined1 (*) [32])(pcVar54 + 0x120) = auVar74;
  auVar74 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar54 + 0x140) = auVar74;
  *(undefined1 (*) [32])(pcVar54 + 0x160) = auVar74;
  *(undefined1 (*) [32])(pcVar54 + 0x180) = auVar74;
  *(undefined1 (*) [32])(pcVar54 + 0x1a0) = auVar74;
  lVar38 = 0;
  do {
    pcVar3 = pcVar54 + lVar38 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\b';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    pcVar3[0x10] = '\b';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    pcVar3[0x18] = '\b';
    pcVar3[0x19] = '\0';
    pcVar3[0x1a] = '\0';
    pcVar3[0x1b] = '\0';
    pcVar3[0x1c] = '\0';
    pcVar3[0x1d] = '\0';
    pcVar3[0x1e] = '\0';
    pcVar3[0x1f] = '\0';
    lVar38 = lVar38 + 4;
  } while (lVar38 != 8);
  uVar43 = 6;
LAB_01413ae6:
  in_00 = (BuildRecord *)&geomID;
  local_1e58._8_4_ = 0xff800000;
  local_1e58._0_8_ = 0xff800000ff800000;
  local_1e58._12_4_ = 0xff800000;
  local_1e38._8_4_ = 0x7f800000;
  local_1e38._0_8_ = 0x7f8000007f800000;
  local_1e38._12_4_ = 0x7f800000;
  if (local_848 != 0) {
    pBVar49 = &values[0].dt;
    uVar63 = 0;
    local_1e38._8_4_ = 0x7f800000;
    local_1e38._0_8_ = 0x7f8000007f800000;
    local_1e38._12_4_ = 0x7f800000;
    local_1df8._8_4_ = 0x7f800000;
    local_1df8._0_8_ = 0x7f8000007f800000;
    local_1df8._12_4_ = 0x7f800000;
    local_1e58._8_4_ = 0xff800000;
    local_1e58._0_8_ = 0xff800000ff800000;
    local_1e58._12_4_ = 0xff800000;
    local_1dc8._8_4_ = 0xff800000;
    local_1dc8._0_8_ = 0xff800000ff800000;
    local_1dc8._12_4_ = 0xff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&v0,this,in_00,alloc);
      vVar33 = v0;
      pBVar49[-10].lower = (float)v0.field_0.v[0]._0_4_;
      pBVar49[-10].upper = (float)v0.field_0._4_4_;
      auVar28._8_8_ = local_1c28._8_8_;
      auVar28._0_8_ = local_1c28._0_8_;
      *(undefined1 (*) [16])(pBVar49 + -8) = auVar28;
      pBVar49[-6].lower = (float)auStack_1c18._0_4_;
      pBVar49[-6].upper = (float)auStack_1c18._4_4_;
      pBVar49[-5].lower = (float)auStack_1c18._8_4_;
      pBVar49[-5].upper = (float)auStack_1c18._12_4_;
      pBVar49[-4].lower = (float)local_1c08._0_4_;
      pBVar49[-4].upper = (float)local_1c08._4_4_;
      pBVar49[-3].lower = (float)local_1c08._8_4_;
      pBVar49[-3].upper = (float)local_1c08._12_4_;
      pBVar49[-2].lower = (float)aStack_1bf8._0_4_;
      pBVar49[-2].upper = aStack_1bf8.m128[1];
      pBVar49[-1].lower = (float)aStack_1bf8._8_4_;
      pBVar49[-1].upper = aStack_1bf8.m128[3];
      pBVar49->lower = (float)local_1be8._0_4_;
      pBVar49->upper = local_1be8.m128[1];
      local_1e58 = vmaxps_avx(local_1e58,*(undefined1 (*) [16])(pBVar49 + -6));
      local_1df8 = vminps_avx(local_1df8,*(undefined1 (*) [16])(pBVar49 + -4));
      local_1e38 = vminps_avx(local_1e38,auVar28);
      local_1dc8 = vmaxps_avx(local_1dc8,*(undefined1 (*) [16])(pBVar49 + -2));
      uVar63 = uVar63 + 1;
      pBVar49 = pBVar49 + 0xc;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
      v0 = vVar33;
    } while (uVar63 < local_848);
  }
  if (((uint)uVar43 | (uint)pcVar54 & 0xf) == 1) {
    if (local_848 != 0) {
      uVar55 = (ulong)pcVar54 & 0xfffffffffffffff0;
      pfVar44 = &values[0].dt.upper;
      uVar63 = 0;
      auVar86._8_4_ = 0x7f7fffff;
      auVar86._0_8_ = 0x7f7fffff7f7fffff;
      auVar86._12_4_ = 0x7f7fffff;
      auVar89._8_4_ = 0xff7fffff;
      auVar89._0_8_ = 0xff7fffffff7fffff;
      auVar89._12_4_ = 0xff7fffff;
      auVar95._8_4_ = 0x7fffffff;
      auVar95._0_8_ = 0x7fffffff7fffffff;
      auVar95._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar55 + uVar63 * 8) = *(undefined8 *)(pfVar44 + -0x15);
        fVar5 = ((BBox1f *)(pfVar44 + -1))->lower;
        fVar101 = 1.0 / (*pfVar44 - fVar5);
        fVar24 = -fVar5 * fVar101;
        auVar68 = vshufps_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),0);
        auVar70 = vshufps_avx(ZEXT416((uint)(1.0 - fVar24)),ZEXT416((uint)(1.0 - fVar24)),0);
        auVar119._0_4_ = pfVar44[-9] * auVar68._0_4_ + pfVar44[-0x11] * auVar70._0_4_;
        auVar119._4_4_ = pfVar44[-8] * auVar68._4_4_ + pfVar44[-0x10] * auVar70._4_4_;
        auVar119._8_4_ = pfVar44[-7] * auVar68._8_4_ + pfVar44[-0xf] * auVar70._8_4_;
        auVar119._12_4_ = pfVar44[-6] * auVar68._12_4_ + pfVar44[-0xe] * auVar70._12_4_;
        auVar107._0_4_ = pfVar44[-5] * auVar68._0_4_ + pfVar44[-0xd] * auVar70._0_4_;
        auVar107._4_4_ = pfVar44[-4] * auVar68._4_4_ + pfVar44[-0xc] * auVar70._4_4_;
        auVar107._8_4_ = pfVar44[-3] * auVar68._8_4_ + pfVar44[-0xb] * auVar70._8_4_;
        auVar107._12_4_ = pfVar44[-2] * auVar68._12_4_ + pfVar44[-10] * auVar70._12_4_;
        fVar101 = (1.0 - fVar5) * fVar101;
        auVar68 = vshufps_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),0);
        auVar70 = vshufps_avx(ZEXT416((uint)(1.0 - fVar101)),ZEXT416((uint)(1.0 - fVar101)),0);
        auVar109._0_4_ = pfVar44[-9] * auVar68._0_4_ + pfVar44[-0x11] * auVar70._0_4_;
        auVar109._4_4_ = pfVar44[-8] * auVar68._4_4_ + pfVar44[-0x10] * auVar70._4_4_;
        auVar109._8_4_ = pfVar44[-7] * auVar68._8_4_ + pfVar44[-0xf] * auVar70._8_4_;
        auVar109._12_4_ = pfVar44[-6] * auVar68._12_4_ + pfVar44[-0xe] * auVar70._12_4_;
        auVar102._0_4_ = pfVar44[-5] * auVar68._0_4_ + pfVar44[-0xd] * auVar70._0_4_;
        auVar102._4_4_ = pfVar44[-4] * auVar68._4_4_ + pfVar44[-0xc] * auVar70._4_4_;
        auVar102._8_4_ = pfVar44[-3] * auVar68._8_4_ + pfVar44[-0xb] * auVar70._8_4_;
        auVar102._12_4_ = pfVar44[-2] * auVar68._12_4_ + pfVar44[-10] * auVar70._12_4_;
        auVar83 = vminps_avx(auVar119,auVar86);
        auVar70 = vmaxps_avx(auVar107,auVar89);
        auVar77 = vminps_avx(auVar109,auVar86);
        auVar69 = vmaxps_avx(auVar102,auVar89);
        auVar68 = vandps_avx(auVar83,auVar95);
        auVar113._0_4_ = auVar68._0_4_ * 4.7683716e-07;
        auVar113._4_4_ = auVar68._4_4_ * 4.7683716e-07;
        auVar113._8_4_ = auVar68._8_4_ * 4.7683716e-07;
        auVar113._12_4_ = auVar68._12_4_ * 4.7683716e-07;
        auVar83 = vsubps_avx(auVar83,auVar113);
        auVar68 = vandps_avx(auVar70,auVar95);
        auVar108._0_4_ = auVar70._0_4_ + auVar68._0_4_ * 4.7683716e-07;
        auVar108._4_4_ = auVar70._4_4_ + auVar68._4_4_ * 4.7683716e-07;
        auVar108._8_4_ = auVar70._8_4_ + auVar68._8_4_ * 4.7683716e-07;
        auVar108._12_4_ = auVar70._12_4_ + auVar68._12_4_ * 4.7683716e-07;
        auVar68 = vandps_avx(auVar77,auVar95);
        auVar114._0_4_ = auVar68._0_4_ * 4.7683716e-07;
        auVar114._4_4_ = auVar68._4_4_ * 4.7683716e-07;
        auVar114._8_4_ = auVar68._8_4_ * 4.7683716e-07;
        auVar114._12_4_ = auVar68._12_4_ * 4.7683716e-07;
        auVar70 = vsubps_avx(auVar77,auVar114);
        auVar68 = vandps_avx(auVar69,auVar95);
        *(int *)(uVar55 + 0x40 + uVar63 * 4) = auVar83._0_4_;
        uVar8 = vextractps_avx(auVar83,1);
        *(undefined4 *)(uVar55 + 0x80 + uVar63 * 4) = uVar8;
        auVar103._0_4_ = auVar68._0_4_ * 4.7683716e-07 + auVar69._0_4_;
        auVar103._4_4_ = auVar68._4_4_ * 4.7683716e-07 + auVar69._4_4_;
        auVar103._8_4_ = auVar68._8_4_ * 4.7683716e-07 + auVar69._8_4_;
        auVar103._12_4_ = auVar68._12_4_ * 4.7683716e-07 + auVar69._12_4_;
        uVar8 = vextractps_avx(auVar83,2);
        *(undefined4 *)(uVar55 + 0xc0 + uVar63 * 4) = uVar8;
        *(float *)(uVar55 + 0x60 + uVar63 * 4) = auVar108._0_4_;
        uVar8 = vextractps_avx(auVar108,1);
        *(undefined4 *)(uVar55 + 0xa0 + uVar63 * 4) = uVar8;
        auVar68 = vsubps_avx(auVar70,auVar83);
        uVar8 = vextractps_avx(auVar108,2);
        *(undefined4 *)(uVar55 + 0xe0 + uVar63 * 4) = uVar8;
        *(int *)(uVar55 + 0x100 + uVar63 * 4) = auVar68._0_4_;
        uVar8 = vextractps_avx(auVar68,1);
        *(undefined4 *)(uVar55 + 0x140 + uVar63 * 4) = uVar8;
        auVar70 = vsubps_avx(auVar103,auVar108);
        uVar8 = vextractps_avx(auVar68,2);
        *(undefined4 *)(uVar55 + 0x180 + uVar63 * 4) = uVar8;
        *(int *)(uVar55 + 0x120 + uVar63 * 4) = auVar70._0_4_;
        uVar8 = vextractps_avx(auVar70,1);
        *(undefined4 *)(uVar55 + 0x160 + uVar63 * 4) = uVar8;
        uVar8 = vextractps_avx(auVar70,2);
        *(undefined4 *)(uVar55 + 0x1a0 + uVar63 * 4) = uVar8;
        uVar63 = uVar63 + 1;
        pfVar44 = pfVar44 + 0x18;
      } while (local_848 != uVar63);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<8>,embree::avx::RecalculatePrimRef<embree::QuadMesh>,embree::FastAllocator::CachedAllocator,embree::BVHN<8>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,8>::Set,embree::avx::CreateMSMBlurLeaf<8,embree::QuadMesh,embree::QuadMi<4>>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  uVar55 = uStack_1850;
  uVar63 = local_1858;
  if ((bVar35 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = uVar43 | (ulong)pcVar54;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1e38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1e38._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1e58._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1e58._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1df8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1df8._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)local_18b8;
    v1.field_0.i[2] = 0x7f800000;
    v1.field_0.v[0] = 0x7f8000007f800000;
    v1.field_0.i[3] = 0x7f800000;
    local_1b28._0_8_ = 0xff800000ff800000;
    local_1b28._8_8_ = 0xff800000ff800000;
    uStack_1b18 = 0x7f8000007f800000;
    uStack_1b10 = 0x7f8000007f800000;
    local_1b08 = 0xff800000ff800000;
    uStack_1b00 = 0xff800000ff800000;
    if (uStack_1850 - local_1858 < 0xc00) {
      v0.field_0.v[1] = uStack_1850;
      v0.field_0.v[0] = local_1858;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&v2,(anon_class_16_2_aeee9775 *)&vSplitPos,(range<unsigned_long> *)&v0)
      ;
    }
    else {
      v0.field_0.v[1]._4_2_ = 0x401;
      auStack_1c18._0_4_ = 0.0;
      auStack_1c18._4_4_ = 0.0;
      auStack_1c18._8_4_ = 0.0;
      auStack_1c18._12_4_ = 0.0;
      aStack_1bf8.m128[0] = 1.12104e-44;
      aStack_1bf8.m128[1] = 0.0;
      tbb::detail::r1::initialize((task_group_context *)&v0);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           uVar63;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           uVar55;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&v2,(d1 *)&right,(blocked_range<unsigned_long> *)&v1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v0,
                 (task_group_context *)
                 new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl);
      cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v0);
      if (cVar36 != '\0') {
        prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar48,"task cancelled");
        __cxa_throw(prVar48,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&v0);
    }
    (__return_storage_ptr__->ref).ptr = uVar43 | (ulong)pcVar54;
    *(longlong *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = v2.field_0.v[0];
    *(longlong *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         v2.field_0.v[1];
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         CONCAT44(aStack_1cd8.m128[1],aStack_1cd8.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(aStack_1cd8.m128[3],aStack_1cd8.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         CONCAT44(local_1cc8.i[1],local_1cc8.i[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1cc8.i[3],local_1cc8.i[2]);
    local_1dc8._0_8_ = CONCAT44(aStack_1cb8.i[1],aStack_1cb8.i[0]);
    local_1dc8._12_4_ = aStack_1cb8.i[3];
    local_1dc8._8_4_ = aStack_1cb8.i[2];
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1dc8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1dc8._8_8_;
  __return_storage_ptr__->dt = BStack_1830;
  if (local_848 == 0) {
    return __return_storage_ptr__;
  }
  uVar43 = 0;
  do {
    pBVar16 = local_8c8[uVar43];
    pBVar49 = pBVar16 + 1;
    *pBVar49 = (BBox1f)((long)*pBVar49 + -1);
    if ((*pBVar49 == (BBox1f)0x0) && (BVar9 = *pBVar16, BVar9 != (BBox1f)0x0)) {
      lVar38 = *(undefined8 *)((long)BVar9 + 0x18);
      pvVar42 = *(void **)((long)BVar9 + 0x20);
      if (pvVar42 != (void *)0x0) {
        if ((ulong)(lVar38 * 0x50) < 0x1c00000) {
          alignedFree(pvVar42);
        }
        else {
          os_free(pvVar42,lVar38 * 0x50,*(bool *)((long)BVar9 + 8));
        }
      }
      if (lVar38 != 0) {
        (**(code **)**(undefined8 **)BVar9)(*(undefined8 **)BVar9,lVar38 * -0x50,1);
      }
      *(undefined8 *)((long)BVar9 + 0x10) = 0;
      *(undefined8 *)((long)BVar9 + 0x18) = 0;
      *(undefined8 *)((long)BVar9 + 0x20) = 0;
      operator_delete((void *)BVar9);
    }
    uVar43 = uVar43 + 1;
  } while (uVar43 < local_848);
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }